

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  float *pfVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  __int_type_conflict _Var4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  ulong uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  byte bVar53;
  byte bVar54;
  byte bVar55;
  long lVar56;
  byte bVar57;
  byte bVar58;
  uint uVar59;
  ulong uVar60;
  int iVar61;
  byte bVar62;
  bool bVar63;
  long lVar64;
  bool bVar65;
  ulong uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar143;
  uint uVar144;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  uint uVar146;
  uint uVar147;
  uint uVar148;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  uint uVar145;
  uint uVar149;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  float fVar150;
  float fVar170;
  float fVar172;
  vint4 bi_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  float fVar171;
  float fVar173;
  float fVar174;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar169 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar178;
  vint4 bi_1;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar192 [16];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar198;
  float fVar226;
  float fVar227;
  vint4 bi;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar228;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar242;
  float fVar243;
  float fVar244;
  vint4 ai_2;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  float fVar252;
  vint4 ai_1;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar260;
  undefined1 auVar259 [32];
  vint4 ai;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar270 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar271 [64];
  float fVar276;
  float fVar277;
  undefined1 auVar272 [16];
  float fVar278;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [64];
  undefined1 auVar279 [16];
  undefined1 auVar280 [64];
  float fVar282;
  undefined1 auVar281 [64];
  undefined1 auVar283 [64];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [32];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar292;
  float fVar293;
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  undefined1 local_910 [8];
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  Primitive *local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_720 [32];
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 auVar130 [32];
  undefined1 auVar288 [64];
  
  PVar2 = prim[1];
  uVar66 = (ulong)(byte)PVar2;
  lVar56 = uVar66 * 0x25;
  fVar260 = *(float *)(prim + lVar56 + 0x12);
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar72 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar73 = vsubps_avx(auVar73,*(undefined1 (*) [16])(prim + lVar56 + 6));
  auVar229._0_4_ = fVar260 * auVar73._0_4_;
  auVar229._4_4_ = fVar260 * auVar73._4_4_;
  auVar229._8_4_ = fVar260 * auVar73._8_4_;
  auVar229._12_4_ = fVar260 * auVar73._12_4_;
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 6)));
  auVar151._0_4_ = fVar260 * auVar72._0_4_;
  auVar151._4_4_ = fVar260 * auVar72._4_4_;
  auVar151._8_4_ = fVar260 * auVar72._8_4_;
  auVar151._12_4_ = fVar260 * auVar72._12_4_;
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 5 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xf + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar66 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1a + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1b + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1c + 6)));
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar253._4_4_ = auVar151._0_4_;
  auVar253._0_4_ = auVar151._0_4_;
  auVar253._8_4_ = auVar151._0_4_;
  auVar253._12_4_ = auVar151._0_4_;
  auVar78 = vshufps_avx(auVar151,auVar151,0x55);
  auVar79 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar260 = auVar79._0_4_;
  auVar199._0_4_ = fVar260 * auVar75._0_4_;
  fVar170 = auVar79._4_4_;
  auVar199._4_4_ = fVar170 * auVar75._4_4_;
  fVar172 = auVar79._8_4_;
  auVar199._8_4_ = fVar172 * auVar75._8_4_;
  fVar276 = auVar79._12_4_;
  auVar199._12_4_ = fVar276 * auVar75._12_4_;
  auVar179._0_4_ = auVar18._0_4_ * fVar260;
  auVar179._4_4_ = auVar18._4_4_ * fVar170;
  auVar179._8_4_ = auVar18._8_4_ * fVar172;
  auVar179._12_4_ = auVar18._12_4_ * fVar276;
  auVar152._0_4_ = auVar248._0_4_ * fVar260;
  auVar152._4_4_ = auVar248._4_4_ * fVar170;
  auVar152._8_4_ = auVar248._8_4_ * fVar172;
  auVar152._12_4_ = auVar248._12_4_ * fVar276;
  auVar79 = vfmadd231ps_fma(auVar199,auVar78,auVar72);
  auVar80 = vfmadd231ps_fma(auVar179,auVar78,auVar17);
  auVar78 = vfmadd231ps_fma(auVar152,auVar74,auVar78);
  auVar82 = vfmadd231ps_fma(auVar79,auVar253,auVar73);
  auVar80 = vfmadd231ps_fma(auVar80,auVar253,auVar76);
  auVar81 = vfmadd231ps_fma(auVar78,auVar77,auVar253);
  auVar290._4_4_ = auVar229._0_4_;
  auVar290._0_4_ = auVar229._0_4_;
  auVar290._8_4_ = auVar229._0_4_;
  auVar290._12_4_ = auVar229._0_4_;
  auVar78 = vshufps_avx(auVar229,auVar229,0x55);
  auVar79 = vshufps_avx(auVar229,auVar229,0xaa);
  fVar260 = auVar79._0_4_;
  auVar254._0_4_ = fVar260 * auVar75._0_4_;
  fVar170 = auVar79._4_4_;
  auVar254._4_4_ = fVar170 * auVar75._4_4_;
  fVar172 = auVar79._8_4_;
  auVar254._8_4_ = fVar172 * auVar75._8_4_;
  fVar276 = auVar79._12_4_;
  auVar254._12_4_ = fVar276 * auVar75._12_4_;
  auVar245._0_4_ = auVar18._0_4_ * fVar260;
  auVar245._4_4_ = auVar18._4_4_ * fVar170;
  auVar245._8_4_ = auVar18._8_4_ * fVar172;
  auVar245._12_4_ = auVar18._12_4_ * fVar276;
  auVar230._0_4_ = auVar248._0_4_ * fVar260;
  auVar230._4_4_ = auVar248._4_4_ * fVar170;
  auVar230._8_4_ = auVar248._8_4_ * fVar172;
  auVar230._12_4_ = auVar248._12_4_ * fVar276;
  auVar72 = vfmadd231ps_fma(auVar254,auVar78,auVar72);
  auVar75 = vfmadd231ps_fma(auVar245,auVar78,auVar17);
  auVar17 = vfmadd231ps_fma(auVar230,auVar78,auVar74);
  auVar279 = vfmadd231ps_fma(auVar72,auVar290,auVar73);
  auVar151 = vfmadd231ps_fma(auVar75,auVar290,auVar76);
  auVar272._8_4_ = 0x7fffffff;
  auVar272._0_8_ = 0x7fffffff7fffffff;
  auVar272._12_4_ = 0x7fffffff;
  auVar152 = vfmadd231ps_fma(auVar17,auVar290,auVar77);
  auVar73 = vandps_avx(auVar272,auVar82);
  auVar266._8_4_ = 0x219392ef;
  auVar266._0_8_ = 0x219392ef219392ef;
  auVar266._12_4_ = 0x219392ef;
  uVar60 = vcmpps_avx512vl(auVar73,auVar266,1);
  bVar63 = (bool)((byte)uVar60 & 1);
  auVar69._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar82._0_4_;
  bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar82._4_4_;
  bVar63 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar82._8_4_;
  bVar63 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar82._12_4_;
  auVar73 = vandps_avx(auVar272,auVar80);
  uVar60 = vcmpps_avx512vl(auVar73,auVar266,1);
  bVar63 = (bool)((byte)uVar60 & 1);
  auVar70._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar80._0_4_;
  bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar80._4_4_;
  bVar63 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar80._8_4_;
  bVar63 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar80._12_4_;
  auVar73 = vandps_avx(auVar272,auVar81);
  uVar60 = vcmpps_avx512vl(auVar73,auVar266,1);
  bVar63 = (bool)((byte)uVar60 & 1);
  auVar71._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar81._0_4_;
  bVar63 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar81._4_4_;
  bVar63 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar81._8_4_;
  bVar63 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar81._12_4_;
  auVar72 = vrcp14ps_avx512vl(auVar69);
  auVar267._8_4_ = 0x3f800000;
  auVar267._0_8_ = 0x3f8000003f800000;
  auVar267._12_4_ = 0x3f800000;
  auVar73 = vfnmadd213ps_fma(auVar69,auVar72,auVar267);
  auVar82 = vfmadd132ps_fma(auVar73,auVar72,auVar72);
  auVar72 = vrcp14ps_avx512vl(auVar70);
  auVar73 = vfnmadd213ps_fma(auVar70,auVar72,auVar267);
  auVar81 = vfmadd132ps_fma(auVar73,auVar72,auVar72);
  auVar72 = vrcp14ps_avx512vl(auVar71);
  auVar73 = vfnmadd213ps_fma(auVar71,auVar72,auVar267);
  auVar83 = vfmadd132ps_fma(auVar73,auVar72,auVar72);
  fVar260 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar56 + 0x16)) *
            *(float *)(prim + lVar56 + 0x1a);
  auVar261._4_4_ = fVar260;
  auVar261._0_4_ = fVar260;
  auVar261._8_4_ = fVar260;
  auVar261._12_4_ = fVar260;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar66 * 7 + 6);
  auVar73 = vpmovsxwd_avx(auVar73);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar66 * 0xb + 6);
  auVar72 = vpmovsxwd_avx(auVar72);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar76 = vsubps_avx(auVar72,auVar73);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar66 * 9 + 6);
  auVar72 = vpmovsxwd_avx(auVar75);
  auVar75 = vfmadd213ps_fma(auVar76,auVar261,auVar73);
  auVar73 = vcvtdq2ps_avx(auVar72);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar66 * 0xd + 6);
  auVar72 = vpmovsxwd_avx(auVar76);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar73);
  auVar76 = vfmadd213ps_fma(auVar72,auVar261,auVar73);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar66 * 0x12 + 6);
  auVar73 = vpmovsxwd_avx(auVar17);
  auVar73 = vcvtdq2ps_avx(auVar73);
  uVar60 = (ulong)(uint)((int)(uVar66 * 5) << 2);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar66 * 2 + uVar60 + 6);
  auVar72 = vpmovsxwd_avx(auVar18);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar73);
  auVar17 = vfmadd213ps_fma(auVar72,auVar261,auVar73);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar60 + 6);
  auVar73 = vpmovsxwd_avx(auVar77);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar66 * 0x18 + 6);
  auVar72 = vpmovsxwd_avx(auVar74);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar73);
  auVar18 = vfmadd213ps_fma(auVar72,auVar261,auVar73);
  auVar248._8_8_ = 0;
  auVar248._0_8_ = *(ulong *)(prim + uVar66 * 0x1d + 6);
  auVar73 = vpmovsxwd_avx(auVar248);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar66 + (ulong)(byte)PVar2 * 0x20 + 6);
  auVar72 = vpmovsxwd_avx(auVar78);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar73);
  auVar77 = vfmadd213ps_fma(auVar72,auVar261,auVar73);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar2 * 0x20 - uVar66) + 6);
  auVar73 = vpmovsxwd_avx(auVar79);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar66 * 0x23 + 6);
  auVar72 = vpmovsxwd_avx(auVar80);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar73);
  auVar72 = vfmadd213ps_fma(auVar72,auVar261,auVar73);
  auVar73 = vsubps_avx(auVar75,auVar279);
  auVar262._0_4_ = auVar82._0_4_ * auVar73._0_4_;
  auVar262._4_4_ = auVar82._4_4_ * auVar73._4_4_;
  auVar262._8_4_ = auVar82._8_4_ * auVar73._8_4_;
  auVar262._12_4_ = auVar82._12_4_ * auVar73._12_4_;
  auVar73 = vsubps_avx(auVar76,auVar279);
  auVar200._0_4_ = auVar82._0_4_ * auVar73._0_4_;
  auVar200._4_4_ = auVar82._4_4_ * auVar73._4_4_;
  auVar200._8_4_ = auVar82._8_4_ * auVar73._8_4_;
  auVar200._12_4_ = auVar82._12_4_ * auVar73._12_4_;
  auVar73 = vsubps_avx(auVar17,auVar151);
  auVar255._0_4_ = auVar81._0_4_ * auVar73._0_4_;
  auVar255._4_4_ = auVar81._4_4_ * auVar73._4_4_;
  auVar255._8_4_ = auVar81._8_4_ * auVar73._8_4_;
  auVar255._12_4_ = auVar81._12_4_ * auVar73._12_4_;
  auVar73 = vsubps_avx(auVar18,auVar151);
  auVar180._0_4_ = auVar81._0_4_ * auVar73._0_4_;
  auVar180._4_4_ = auVar81._4_4_ * auVar73._4_4_;
  auVar180._8_4_ = auVar81._8_4_ * auVar73._8_4_;
  auVar180._12_4_ = auVar81._12_4_ * auVar73._12_4_;
  auVar73 = vsubps_avx(auVar77,auVar152);
  auVar246._0_4_ = auVar83._0_4_ * auVar73._0_4_;
  auVar246._4_4_ = auVar83._4_4_ * auVar73._4_4_;
  auVar246._8_4_ = auVar83._8_4_ * auVar73._8_4_;
  auVar246._12_4_ = auVar83._12_4_ * auVar73._12_4_;
  auVar73 = vsubps_avx(auVar72,auVar152);
  auVar153._0_4_ = auVar83._0_4_ * auVar73._0_4_;
  auVar153._4_4_ = auVar83._4_4_ * auVar73._4_4_;
  auVar153._8_4_ = auVar83._8_4_ * auVar73._8_4_;
  auVar153._12_4_ = auVar83._12_4_ * auVar73._12_4_;
  auVar73 = vpminsd_avx(auVar262,auVar200);
  auVar72 = vpminsd_avx(auVar255,auVar180);
  auVar73 = vmaxps_avx(auVar73,auVar72);
  auVar72 = vpminsd_avx(auVar246,auVar153);
  uVar178 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar82._4_4_ = uVar178;
  auVar82._0_4_ = uVar178;
  auVar82._8_4_ = uVar178;
  auVar82._12_4_ = uVar178;
  auVar72 = vmaxps_avx512vl(auVar72,auVar82);
  auVar73 = vmaxps_avx(auVar73,auVar72);
  auVar81._8_4_ = 0x3f7ffffa;
  auVar81._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar81._12_4_ = 0x3f7ffffa;
  local_6e0 = vmulps_avx512vl(auVar73,auVar81);
  auVar73 = vpmaxsd_avx(auVar262,auVar200);
  auVar72 = vpmaxsd_avx(auVar255,auVar180);
  auVar73 = vminps_avx(auVar73,auVar72);
  auVar72 = vpmaxsd_avx(auVar246,auVar153);
  uVar178 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar83._4_4_ = uVar178;
  auVar83._0_4_ = uVar178;
  auVar83._8_4_ = uVar178;
  auVar83._12_4_ = uVar178;
  auVar72 = vminps_avx512vl(auVar72,auVar83);
  auVar73 = vminps_avx(auVar73,auVar72);
  auVar279._8_4_ = 0x3f800003;
  auVar279._0_8_ = 0x3f8000033f800003;
  auVar279._12_4_ = 0x3f800003;
  auVar73 = vmulps_avx512vl(auVar73,auVar279);
  auVar72 = vpbroadcastd_avx512vl();
  uVar19 = vcmpps_avx512vl(local_6e0,auVar73,2);
  local_8c8 = vpcmpgtd_avx512vl(auVar72,_DAT_01f7fcf0);
  local_8c8 = ((byte)uVar19 & 0xf) & local_8c8;
  if ((char)local_8c8 == '\0') {
    return false;
  }
  auVar169 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar169);
  local_8d0 = prim;
LAB_01bad06a:
  lVar56 = 0;
  for (uVar60 = local_8c8; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    lVar56 = lVar56 + 1;
  }
  uVar59 = *(uint *)(local_8d0 + 2);
  pGVar3 = (context->scene->geometries).items[uVar59].ptr;
  uVar60 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(local_8d0 + lVar56 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar260 = (pGVar3->time_range).lower;
  fVar260 = pGVar3->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar260) / ((pGVar3->time_range).upper - fVar260));
  auVar73 = vroundss_avx(ZEXT416((uint)fVar260),ZEXT416((uint)fVar260),9);
  auVar73 = vminss_avx(auVar73,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar73 = vmaxss_avx(ZEXT816(0) << 0x20,auVar73);
  fVar260 = fVar260 - auVar73._0_4_;
  _Var4 = pGVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar64 = (long)(int)auVar73._0_4_ * 0x38;
  lVar56 = *(long *)(_Var4 + 0x10 + lVar64);
  lVar5 = *(long *)(_Var4 + 0x38 + lVar64);
  lVar6 = *(long *)(_Var4 + 0x48 + lVar64);
  pfVar1 = (float *)(lVar5 + uVar60 * lVar6);
  auVar154._0_4_ = fVar260 * *pfVar1;
  auVar154._4_4_ = fVar260 * pfVar1[1];
  auVar154._8_4_ = fVar260 * pfVar1[2];
  auVar154._12_4_ = fVar260 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar60 + 1) * lVar6);
  auVar181._0_4_ = fVar260 * *pfVar1;
  auVar181._4_4_ = fVar260 * pfVar1[1];
  auVar181._8_4_ = fVar260 * pfVar1[2];
  auVar181._12_4_ = fVar260 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar60 + 2) * lVar6);
  auVar201._0_4_ = fVar260 * *pfVar1;
  auVar201._4_4_ = fVar260 * pfVar1[1];
  auVar201._8_4_ = fVar260 * pfVar1[2];
  auVar201._12_4_ = fVar260 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + lVar6 * (uVar60 + 3));
  auVar231._0_4_ = fVar260 * *pfVar1;
  auVar231._4_4_ = fVar260 * pfVar1[1];
  auVar231._8_4_ = fVar260 * pfVar1[2];
  auVar231._12_4_ = fVar260 * pfVar1[3];
  lVar5 = *(long *)(_Var4 + lVar64);
  fVar260 = 1.0 - fVar260;
  auVar247._4_4_ = fVar260;
  auVar247._0_4_ = fVar260;
  auVar247._8_4_ = fVar260;
  auVar247._12_4_ = fVar260;
  auVar75 = vfmadd231ps_fma(auVar154,auVar247,*(undefined1 (*) [16])(lVar5 + lVar56 * uVar60));
  auVar76 = vfmadd231ps_fma(auVar181,auVar247,*(undefined1 (*) [16])(lVar5 + lVar56 * (uVar60 + 1)))
  ;
  auVar17 = vfmadd231ps_fma(auVar201,auVar247,*(undefined1 (*) [16])(lVar5 + lVar56 * (uVar60 + 2)))
  ;
  auVar18 = vfmadd231ps_fma(auVar231,auVar247,*(undefined1 (*) [16])(lVar5 + lVar56 * (uVar60 + 3)))
  ;
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar72 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar178 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar284._4_4_ = uVar178;
  auVar284._0_4_ = uVar178;
  auVar284._8_4_ = uVar178;
  auVar284._12_4_ = uVar178;
  fStack_7d0 = (float)uVar178;
  _local_7e0 = auVar284;
  fStack_7cc = (float)uVar178;
  fStack_7c8 = (float)uVar178;
  register0x0000151c = uVar178;
  auVar288 = ZEXT3264(_local_7e0);
  uVar178 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar289._4_4_ = uVar178;
  auVar289._0_4_ = uVar178;
  auVar289._8_4_ = uVar178;
  auVar289._12_4_ = uVar178;
  local_800._16_4_ = uVar178;
  local_800._0_16_ = auVar289;
  local_800._20_4_ = uVar178;
  local_800._24_4_ = uVar178;
  local_800._28_4_ = uVar178;
  auVar73 = vunpcklps_avx(auVar284,auVar289);
  fVar260 = *(float *)(ray + k * 4 + 0x180);
  auVar291._4_4_ = fVar260;
  auVar291._0_4_ = fVar260;
  auVar291._8_4_ = fVar260;
  auVar291._12_4_ = fVar260;
  local_820._16_4_ = fVar260;
  local_820._0_16_ = auVar291;
  local_820._20_4_ = fVar260;
  local_820._24_4_ = fVar260;
  local_820._28_4_ = fVar260;
  local_9d0 = vinsertps_avx(auVar73,auVar291,0x28);
  auVar280 = ZEXT1664(local_9d0);
  auVar256._0_4_ = auVar75._0_4_ + auVar76._0_4_ + auVar17._0_4_ + auVar18._0_4_;
  auVar256._4_4_ = auVar75._4_4_ + auVar76._4_4_ + auVar17._4_4_ + auVar18._4_4_;
  auVar256._8_4_ = auVar75._8_4_ + auVar76._8_4_ + auVar17._8_4_ + auVar18._8_4_;
  auVar256._12_4_ = auVar75._12_4_ + auVar76._12_4_ + auVar17._12_4_ + auVar18._12_4_;
  auVar24._8_4_ = 0x3e800000;
  auVar24._0_8_ = 0x3e8000003e800000;
  auVar24._12_4_ = 0x3e800000;
  auVar73 = vmulps_avx512vl(auVar256,auVar24);
  auVar73 = vsubps_avx(auVar73,auVar72);
  auVar73 = vdpps_avx(auVar73,local_9d0,0x7f);
  fVar170 = *(float *)(ray + k * 4 + 0xc0);
  auVar281 = ZEXT464((uint)fVar170);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar283 = ZEXT1664(local_9e0);
  auVar169 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar169);
  auVar263._4_12_ = ZEXT812(0) << 0x20;
  auVar263._0_4_ = local_9e0._0_4_;
  auVar74 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar263);
  auVar77 = vfnmadd213ss_fma(auVar74,local_9e0,ZEXT416(0x40000000));
  fVar172 = auVar73._0_4_ * auVar74._0_4_ * auVar77._0_4_;
  auVar264._4_4_ = fVar172;
  auVar264._0_4_ = fVar172;
  auVar264._8_4_ = fVar172;
  auVar264._12_4_ = fVar172;
  auVar73 = vfmadd231ps_fma(auVar72,local_9d0,auVar264);
  auVar73 = vblendps_avx(auVar73,ZEXT816(0) << 0x40,8);
  auVar72 = vsubps_avx(auVar75,auVar73);
  auVar75 = vsubps_avx(auVar17,auVar73);
  auVar271 = ZEXT1664(auVar75);
  auVar76 = vsubps_avx(auVar76,auVar73);
  auVar275 = ZEXT1664(auVar76);
  auVar73 = vsubps_avx(auVar18,auVar73);
  auVar84 = vbroadcastss_avx512vl(auVar72);
  auVar96._8_4_ = 1;
  auVar96._0_8_ = 0x100000001;
  auVar96._12_4_ = 1;
  auVar96._16_4_ = 1;
  auVar96._20_4_ = 1;
  auVar96._24_4_ = 1;
  auVar96._28_4_ = 1;
  local_960 = ZEXT1632(auVar72);
  auVar85 = vpermps_avx512vl(auVar96,local_960);
  auVar97._8_4_ = 2;
  auVar97._0_8_ = 0x200000002;
  auVar97._12_4_ = 2;
  auVar97._16_4_ = 2;
  auVar97._20_4_ = 2;
  auVar97._24_4_ = 2;
  auVar97._28_4_ = 2;
  auVar86 = vpermps_avx512vl(auVar97,local_960);
  auVar100._8_4_ = 3;
  auVar100._0_8_ = 0x300000003;
  auVar100._12_4_ = 3;
  auVar100._16_4_ = 3;
  auVar100._20_4_ = 3;
  auVar100._24_4_ = 3;
  auVar100._28_4_ = 3;
  auVar87 = vpermps_avx512vl(auVar100,local_960);
  auVar88 = vbroadcastss_avx512vl(auVar76);
  local_9a0 = ZEXT1632(auVar76);
  auVar89 = vpermps_avx512vl(auVar96,local_9a0);
  auVar90 = vpermps_avx512vl(auVar97,local_9a0);
  auVar91 = vpermps_avx512vl(auVar100,local_9a0);
  auVar92 = vbroadcastss_avx512vl(auVar75);
  local_980 = ZEXT1632(auVar75);
  auVar93 = vpermps_avx512vl(auVar96,local_980);
  auVar94 = vpermps_avx512vl(auVar97,local_980);
  auVar95 = vpermps_avx512vl(auVar100,local_980);
  local_5a0 = vbroadcastss_avx512vl(auVar73);
  _local_9c0 = ZEXT1632(auVar73);
  local_5c0 = vpermps_avx2(auVar96,_local_9c0);
  local_580 = vpermps_avx512vl(auVar97,_local_9c0);
  local_600 = vpermps_avx2(auVar100,_local_9c0);
  auVar73 = vfmadd231ps_fma(ZEXT432((uint)(fVar260 * fVar260)),local_800,local_800);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),_local_7e0,_local_7e0);
  local_560._0_4_ = auVar73._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  auVar99._8_4_ = 0x7fffffff;
  auVar99._0_8_ = 0x7fffffff7fffffff;
  auVar99._12_4_ = 0x7fffffff;
  auVar99._16_4_ = 0x7fffffff;
  auVar99._20_4_ = 0x7fffffff;
  auVar99._24_4_ = 0x7fffffff;
  auVar99._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar99);
  local_930 = ZEXT416((uint)fVar172);
  local_620 = fVar170 - fVar172;
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  uVar60 = 0;
  bVar63 = false;
  iVar61 = 1;
  auVar169 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar169);
  auVar73 = vsqrtss_avx(local_9e0,local_9e0);
  auVar72 = vsqrtss_avx(local_9e0,local_9e0);
  auVar169 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_5e0 = local_580;
  fVar260 = 0.0;
  do {
    local_6d0 = auVar169._0_16_;
    auVar75 = vmovshdup_avx(local_6d0);
    auVar75 = vsubps_avx(auVar75,local_6d0);
    auVar162._0_4_ = auVar75._0_4_;
    fVar16 = auVar162._0_4_ * 0.04761905;
    uVar178 = auVar169._0_4_;
    auVar251._4_4_ = uVar178;
    auVar251._0_4_ = uVar178;
    auVar251._8_4_ = uVar178;
    auVar251._12_4_ = uVar178;
    auVar251._16_4_ = uVar178;
    auVar251._20_4_ = uVar178;
    auVar251._24_4_ = uVar178;
    auVar251._28_4_ = uVar178;
    auVar162._4_4_ = auVar162._0_4_;
    auVar162._8_4_ = auVar162._0_4_;
    auVar162._12_4_ = auVar162._0_4_;
    auVar162._16_4_ = auVar162._0_4_;
    auVar162._20_4_ = auVar162._0_4_;
    auVar162._24_4_ = auVar162._0_4_;
    auVar162._28_4_ = auVar162._0_4_;
    auVar75 = vfmadd231ps_fma(auVar251,auVar162,_DAT_01faff20);
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar97 = vsubps_avx512vl(auVar96,ZEXT1632(auVar75));
    fVar276 = auVar97._0_4_;
    fVar278 = auVar97._4_4_;
    fVar243 = auVar97._8_4_;
    fVar292 = auVar97._12_4_;
    fVar293 = auVar97._16_4_;
    fVar198 = auVar97._20_4_;
    fVar15 = auVar97._24_4_;
    fVar150 = fVar276 * fVar276 * fVar276;
    fVar171 = fVar278 * fVar278 * fVar278;
    auVar101._4_4_ = fVar171;
    auVar101._0_4_ = fVar150;
    fVar173 = fVar243 * fVar243 * fVar243;
    auVar101._8_4_ = fVar173;
    fVar174 = fVar292 * fVar292 * fVar292;
    auVar101._12_4_ = fVar174;
    fVar175 = fVar293 * fVar293 * fVar293;
    auVar101._16_4_ = fVar175;
    fVar176 = fVar198 * fVar198 * fVar198;
    auVar101._20_4_ = fVar176;
    fVar177 = fVar15 * fVar15 * fVar15;
    auVar101._24_4_ = fVar177;
    auVar101._28_4_ = auVar162._0_4_;
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar99 = vmulps_avx512vl(auVar101,auVar98);
    fVar277 = auVar75._0_4_;
    fVar242 = auVar75._4_4_;
    fVar244 = auVar75._8_4_;
    fVar252 = auVar75._12_4_;
    fVar197 = fVar277 * fVar277 * fVar277;
    fVar226 = fVar242 * fVar242 * fVar242;
    fVar227 = fVar244 * fVar244 * fVar244;
    fVar228 = fVar252 * fVar252 * fVar252;
    auVar121._28_4_ = DAT_01faff20._28_4_;
    auVar121._0_28_ = ZEXT1628(CONCAT412(fVar228,CONCAT48(fVar227,CONCAT44(fVar226,fVar197))));
    auVar169._0_4_ = fVar277 * fVar276;
    auVar169._4_4_ = fVar242 * fVar278;
    auVar169._8_4_ = fVar244 * fVar243;
    auVar169._12_4_ = fVar252 * fVar292;
    auVar169._16_4_ = fVar293 * 0.0;
    auVar169._20_4_ = fVar198 * 0.0;
    auVar169._28_36_ = auVar280._28_36_;
    auVar169._24_4_ = fVar15 * 0.0;
    auVar100 = vmulps_avx512vl(auVar121,auVar98);
    fVar282 = auVar100._28_4_ + auVar162._0_4_;
    fVar260 = fVar282 + auVar283._28_4_ + fVar260;
    auVar106._4_4_ = fVar171 * 0.16666667;
    auVar106._0_4_ = fVar150 * 0.16666667;
    auVar106._8_4_ = fVar173 * 0.16666667;
    auVar106._12_4_ = fVar174 * 0.16666667;
    auVar106._16_4_ = fVar175 * 0.16666667;
    auVar106._20_4_ = fVar176 * 0.16666667;
    auVar106._24_4_ = fVar177 * 0.16666667;
    auVar106._28_4_ = fVar282;
    auVar103._4_4_ =
         (auVar169._4_4_ * fVar278 * 12.0 + auVar169._4_4_ * fVar242 * 6.0 + fVar226 + auVar99._4_4_
         ) * 0.16666667;
    auVar103._0_4_ =
         (auVar169._0_4_ * fVar276 * 12.0 + auVar169._0_4_ * fVar277 * 6.0 + fVar197 + auVar99._0_4_
         ) * 0.16666667;
    auVar103._8_4_ =
         (auVar169._8_4_ * fVar243 * 12.0 + auVar169._8_4_ * fVar244 * 6.0 + fVar227 + auVar99._8_4_
         ) * 0.16666667;
    auVar103._12_4_ =
         (auVar169._12_4_ * fVar292 * 12.0 + auVar169._12_4_ * fVar252 * 6.0 +
         fVar228 + auVar99._12_4_) * 0.16666667;
    auVar103._16_4_ =
         (auVar169._16_4_ * fVar293 * 12.0 + auVar169._16_4_ * 0.0 * 6.0 + auVar99._16_4_ + 0.0) *
         0.16666667;
    auVar103._20_4_ =
         (auVar169._20_4_ * fVar198 * 12.0 + auVar169._20_4_ * 0.0 * 6.0 + auVar99._20_4_ + 0.0) *
         0.16666667;
    auVar103._24_4_ =
         (auVar169._24_4_ * fVar15 * 12.0 + auVar169._24_4_ * 0.0 * 6.0 + auVar99._24_4_ + 0.0) *
         0.16666667;
    auVar103._28_4_ = auVar283._28_4_;
    auVar104._4_4_ =
         (auVar100._4_4_ + fVar171 +
         auVar169._4_4_ * fVar242 * 12.0 + auVar169._4_4_ * fVar278 * 6.0) * 0.16666667;
    auVar104._0_4_ =
         (auVar100._0_4_ + fVar150 +
         auVar169._0_4_ * fVar277 * 12.0 + auVar169._0_4_ * fVar276 * 6.0) * 0.16666667;
    auVar104._8_4_ =
         (auVar100._8_4_ + fVar173 +
         auVar169._8_4_ * fVar244 * 12.0 + auVar169._8_4_ * fVar243 * 6.0) * 0.16666667;
    auVar104._12_4_ =
         (auVar100._12_4_ + fVar174 +
         auVar169._12_4_ * fVar252 * 12.0 + auVar169._12_4_ * fVar292 * 6.0) * 0.16666667;
    auVar104._16_4_ =
         (auVar100._16_4_ + fVar175 + auVar169._16_4_ * 0.0 * 12.0 + auVar169._16_4_ * fVar293 * 6.0
         ) * 0.16666667;
    auVar104._20_4_ =
         (auVar100._20_4_ + fVar176 + auVar169._20_4_ * 0.0 * 12.0 + auVar169._20_4_ * fVar198 * 6.0
         ) * 0.16666667;
    auVar104._24_4_ =
         (auVar100._24_4_ + fVar177 + auVar169._24_4_ * 0.0 * 12.0 + auVar169._24_4_ * fVar15 * 6.0)
         * 0.16666667;
    auVar104._28_4_ = auVar288._28_4_;
    fVar197 = fVar197 * 0.16666667;
    fVar226 = fVar226 * 0.16666667;
    fVar227 = fVar227 * 0.16666667;
    fVar228 = fVar228 * 0.16666667;
    auVar105._28_4_ = fVar260;
    auVar105._0_28_ = ZEXT1628(CONCAT412(fVar228,CONCAT48(fVar227,CONCAT44(fVar226,fVar197))));
    auVar100 = vmulps_avx512vl(local_5a0,auVar105);
    auVar108._4_4_ = local_5c0._4_4_ * fVar226;
    auVar108._0_4_ = local_5c0._0_4_ * fVar197;
    auVar108._8_4_ = local_5c0._8_4_ * fVar227;
    auVar108._12_4_ = local_5c0._12_4_ * fVar228;
    auVar108._16_4_ = local_5c0._16_4_ * 0.0;
    auVar108._20_4_ = local_5c0._20_4_ * 0.0;
    auVar108._24_4_ = local_5c0._24_4_ * 0.0;
    auVar108._28_4_ = auVar281._28_4_ + auVar288._28_4_ + DAT_01faff20._28_4_ + auVar99._28_4_;
    auVar99 = vmulps_avx512vl(local_5e0,auVar105);
    auVar109._4_4_ = local_600._4_4_ * fVar226;
    auVar109._0_4_ = local_600._0_4_ * fVar197;
    auVar109._8_4_ = local_600._8_4_ * fVar227;
    auVar109._12_4_ = local_600._12_4_ * fVar228;
    auVar109._16_4_ = local_600._16_4_ * 0.0;
    auVar109._20_4_ = local_600._20_4_ * 0.0;
    auVar109._24_4_ = local_600._24_4_ * 0.0;
    auVar109._28_4_ = fVar260;
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar104,auVar92);
    auVar101 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar93);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,auVar94);
    auVar102 = vfmadd231ps_avx512vl(auVar109,auVar95,auVar104);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,auVar88);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,auVar89);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,auVar90);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar91,auVar103);
    auVar103 = vfmadd231ps_avx512vl(auVar100,auVar106,auVar84);
    auVar104 = vfmadd231ps_avx512vl(auVar101,auVar106,auVar85);
    auVar105 = vfmadd231ps_avx512vl(auVar99,auVar106,auVar86);
    auVar100 = vfmadd231ps_avx512vl(auVar102,auVar87,auVar106);
    auVar106 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar101 = vxorps_avx512vl(auVar97,auVar106);
    auVar102 = vxorps_avx512vl(ZEXT1632(auVar75),auVar106);
    auVar122._0_4_ = auVar102._0_4_ * fVar277;
    auVar122._4_4_ = auVar102._4_4_ * fVar242;
    auVar122._8_4_ = auVar102._8_4_ * fVar244;
    auVar122._12_4_ = auVar102._12_4_ * fVar252;
    auVar122._16_4_ = auVar102._16_4_ * 0.0;
    auVar122._20_4_ = auVar102._20_4_ * 0.0;
    auVar122._24_4_ = auVar102._24_4_ * 0.0;
    auVar122._28_4_ = 0;
    auVar107 = vmulps_avx512vl(auVar169._0_32_,auVar98);
    auVar99 = vsubps_avx(auVar122,auVar107);
    auVar110._4_4_ = auVar101._4_4_ * fVar278 * 0.5;
    auVar110._0_4_ = auVar101._0_4_ * fVar276 * 0.5;
    auVar110._8_4_ = auVar101._8_4_ * fVar243 * 0.5;
    auVar110._12_4_ = auVar101._12_4_ * fVar292 * 0.5;
    auVar110._16_4_ = auVar101._16_4_ * fVar293 * 0.5;
    auVar110._20_4_ = auVar101._20_4_ * fVar198 * 0.5;
    auVar110._24_4_ = auVar101._24_4_ * fVar15 * 0.5;
    auVar110._28_4_ = auVar97._28_4_;
    auVar111._4_4_ = auVar99._4_4_ * 0.5;
    auVar111._0_4_ = auVar99._0_4_ * 0.5;
    auVar111._8_4_ = auVar99._8_4_ * 0.5;
    auVar111._12_4_ = auVar99._12_4_ * 0.5;
    auVar111._16_4_ = auVar99._16_4_ * 0.5;
    auVar111._20_4_ = auVar99._20_4_ * 0.5;
    auVar111._24_4_ = auVar99._24_4_ * 0.5;
    auVar111._28_4_ = auVar99._28_4_;
    auVar112._4_4_ = (auVar107._4_4_ + fVar278 * fVar278) * 0.5;
    auVar112._0_4_ = (auVar107._0_4_ + fVar276 * fVar276) * 0.5;
    auVar112._8_4_ = (auVar107._8_4_ + fVar243 * fVar243) * 0.5;
    auVar112._12_4_ = (auVar107._12_4_ + fVar292 * fVar292) * 0.5;
    auVar112._16_4_ = (auVar107._16_4_ + fVar293 * fVar293) * 0.5;
    auVar112._20_4_ = (auVar107._20_4_ + fVar198 * fVar198) * 0.5;
    auVar112._24_4_ = (auVar107._24_4_ + fVar15 * fVar15) * 0.5;
    auVar112._28_4_ = auVar107._28_4_ + auVar271._28_4_;
    fVar260 = fVar277 * fVar277 * 0.5;
    fVar276 = fVar242 * fVar242 * 0.5;
    fVar277 = fVar244 * fVar244 * 0.5;
    fVar278 = fVar252 * fVar252 * 0.5;
    auVar113._28_4_ = auVar275._28_4_;
    auVar113._0_28_ = ZEXT1628(CONCAT412(fVar278,CONCAT48(fVar277,CONCAT44(fVar276,fVar260))));
    auVar99 = vmulps_avx512vl(local_5a0,auVar113);
    auVar117._4_4_ = local_5c0._4_4_ * fVar276;
    auVar117._0_4_ = local_5c0._0_4_ * fVar260;
    auVar117._8_4_ = local_5c0._8_4_ * fVar277;
    auVar117._12_4_ = local_5c0._12_4_ * fVar278;
    auVar117._16_4_ = local_5c0._16_4_ * 0.0;
    auVar117._20_4_ = local_5c0._20_4_ * 0.0;
    auVar117._24_4_ = local_5c0._24_4_ * 0.0;
    auVar117._28_4_ = auVar102._28_4_;
    auVar97 = vmulps_avx512vl(local_5e0,auVar113);
    auVar118._4_4_ = fVar276 * local_600._4_4_;
    auVar118._0_4_ = fVar260 * local_600._0_4_;
    auVar118._8_4_ = fVar277 * local_600._8_4_;
    auVar118._12_4_ = fVar278 * local_600._12_4_;
    auVar118._16_4_ = local_600._16_4_ * 0.0;
    auVar118._20_4_ = local_600._20_4_ * 0.0;
    auVar118._24_4_ = local_600._24_4_ * 0.0;
    auVar118._28_4_ = auVar275._28_4_;
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar112,auVar92);
    auVar101 = vfmadd231ps_avx512vl(auVar117,auVar112,auVar93);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar112,auVar94);
    auVar75 = vfmadd231ps_fma(auVar118,auVar95,auVar112);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar111,auVar88);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar111,auVar89);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar111,auVar90);
    auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar91,auVar111);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar110,auVar84);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar110,auVar85);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar110,auVar86);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar87,auVar110);
    auVar127._4_4_ = auVar99._4_4_ * fVar16;
    auVar127._0_4_ = auVar99._0_4_ * fVar16;
    auVar127._8_4_ = auVar99._8_4_ * fVar16;
    auVar127._12_4_ = auVar99._12_4_ * fVar16;
    auVar127._16_4_ = auVar99._16_4_ * fVar16;
    auVar127._20_4_ = auVar99._20_4_ * fVar16;
    auVar127._24_4_ = auVar99._24_4_ * fVar16;
    auVar127._28_4_ = auVar95._28_4_;
    auVar288 = ZEXT3264(auVar127);
    auVar128._4_4_ = auVar101._4_4_ * fVar16;
    auVar128._0_4_ = auVar101._0_4_ * fVar16;
    auVar128._8_4_ = auVar101._8_4_ * fVar16;
    auVar128._12_4_ = auVar101._12_4_ * fVar16;
    auVar128._16_4_ = auVar101._16_4_ * fVar16;
    auVar128._20_4_ = auVar101._20_4_ * fVar16;
    auVar128._24_4_ = auVar101._24_4_ * fVar16;
    auVar128._28_4_ = 0x3e2aaaab;
    auVar129._4_4_ = auVar97._4_4_ * fVar16;
    auVar129._0_4_ = auVar97._0_4_ * fVar16;
    auVar129._8_4_ = auVar97._8_4_ * fVar16;
    auVar129._12_4_ = auVar97._12_4_ * fVar16;
    auVar129._16_4_ = auVar97._16_4_ * fVar16;
    auVar129._20_4_ = auVar97._20_4_ * fVar16;
    auVar129._24_4_ = auVar97._24_4_ * fVar16;
    auVar129._28_4_ = 0x40c00000;
    fVar260 = auVar102._0_4_ * fVar16;
    fVar276 = auVar102._4_4_ * fVar16;
    auVar119._4_4_ = fVar276;
    auVar119._0_4_ = fVar260;
    fVar277 = auVar102._8_4_ * fVar16;
    auVar119._8_4_ = fVar277;
    fVar278 = auVar102._12_4_ * fVar16;
    auVar119._12_4_ = fVar278;
    fVar242 = auVar102._16_4_ * fVar16;
    auVar119._16_4_ = fVar242;
    fVar243 = auVar102._20_4_ * fVar16;
    auVar119._20_4_ = fVar243;
    fVar244 = auVar102._24_4_ * fVar16;
    auVar119._24_4_ = fVar244;
    auVar119._28_4_ = fVar16;
    auVar75 = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
    auVar108 = vpermt2ps_avx512vl(auVar103,_DAT_01feed00,ZEXT1632(auVar75));
    auVar280 = ZEXT3264(auVar108);
    auVar109 = vpermt2ps_avx512vl(auVar104,_DAT_01feed00,ZEXT1632(auVar75));
    auVar281 = ZEXT3264(auVar109);
    auVar97 = ZEXT1632(auVar75);
    auVar110 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,auVar97);
    auVar283 = ZEXT3264(auVar110);
    auVar123._0_4_ = fVar260 + auVar100._0_4_;
    auVar123._4_4_ = fVar276 + auVar100._4_4_;
    auVar123._8_4_ = fVar277 + auVar100._8_4_;
    auVar123._12_4_ = fVar278 + auVar100._12_4_;
    auVar123._16_4_ = fVar242 + auVar100._16_4_;
    auVar123._20_4_ = fVar243 + auVar100._20_4_;
    auVar123._24_4_ = fVar244 + auVar100._24_4_;
    auVar123._28_4_ = fVar16 + auVar100._28_4_;
    auVar99 = vmaxps_avx(auVar100,auVar123);
    auVar96 = vminps_avx(auVar100,auVar123);
    auVar107 = vpermt2ps_avx512vl(auVar100,_DAT_01feed00,auVar97);
    auVar111 = vpermt2ps_avx512vl(auVar127,_DAT_01feed00,auVar97);
    auVar275 = ZEXT3264(auVar111);
    auVar112 = vpermt2ps_avx512vl(auVar128,_DAT_01feed00,auVar97);
    auVar132 = ZEXT1632(auVar75);
    auVar113 = vpermt2ps_avx512vl(auVar129,_DAT_01feed00,auVar132);
    auVar97 = vpermt2ps_avx512vl(auVar119,_DAT_01feed00,auVar132);
    auVar114 = vsubps_avx512vl(auVar107,auVar97);
    auVar97 = vsubps_avx(auVar108,auVar103);
    auVar271 = ZEXT3264(auVar97);
    auVar100 = vsubps_avx(auVar109,auVar104);
    auVar101 = vsubps_avx(auVar110,auVar105);
    auVar102 = vmulps_avx512vl(auVar100,auVar129);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar128,auVar101);
    auVar115 = vmulps_avx512vl(auVar101,auVar127);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar129,auVar97);
    auVar116 = vmulps_avx512vl(auVar97,auVar128);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar127,auVar100);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar102,auVar102);
    auVar102 = vmulps_avx512vl(auVar101,auVar101);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar100,auVar100);
    auVar116 = vfmadd231ps_avx512vl(auVar102,auVar97,auVar97);
    auVar117 = vrcp14ps_avx512vl(auVar116);
    auVar102._8_4_ = 0x3f800000;
    auVar102._0_8_ = 0x3f8000003f800000;
    auVar102._12_4_ = 0x3f800000;
    auVar102._16_4_ = 0x3f800000;
    auVar102._20_4_ = 0x3f800000;
    auVar102._24_4_ = 0x3f800000;
    auVar102._28_4_ = 0x3f800000;
    auVar102 = vfnmadd213ps_avx512vl(auVar117,auVar116,auVar102);
    auVar102 = vfmadd132ps_avx512vl(auVar102,auVar117,auVar117);
    auVar115 = vmulps_avx512vl(auVar115,auVar102);
    auVar117 = vmulps_avx512vl(auVar100,auVar113);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar112,auVar101);
    auVar118 = vmulps_avx512vl(auVar101,auVar111);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar113,auVar97);
    auVar119 = vmulps_avx512vl(auVar97,auVar112);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar111,auVar100);
    auVar119 = vmulps_avx512vl(auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar102 = vmulps_avx512vl(auVar117,auVar102);
    auVar102 = vmaxps_avx512vl(auVar115,auVar102);
    auVar102 = vsqrtps_avx512vl(auVar102);
    auVar115 = vmaxps_avx512vl(auVar114,auVar107);
    auVar99 = vmaxps_avx512vl(auVar99,auVar115);
    auVar117 = vaddps_avx512vl(auVar102,auVar99);
    auVar99 = vminps_avx512vl(auVar114,auVar107);
    auVar99 = vminps_avx(auVar96,auVar99);
    auVar99 = vsubps_avx512vl(auVar99,auVar102);
    auVar107._8_4_ = 0x3f800002;
    auVar107._0_8_ = 0x3f8000023f800002;
    auVar107._12_4_ = 0x3f800002;
    auVar107._16_4_ = 0x3f800002;
    auVar107._20_4_ = 0x3f800002;
    auVar107._24_4_ = 0x3f800002;
    auVar107._28_4_ = 0x3f800002;
    auVar96 = vmulps_avx512vl(auVar117,auVar107);
    auVar114._8_4_ = 0x3f7ffffc;
    auVar114._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar114._12_4_ = 0x3f7ffffc;
    auVar114._16_4_ = 0x3f7ffffc;
    auVar114._20_4_ = 0x3f7ffffc;
    auVar114._24_4_ = 0x3f7ffffc;
    auVar114._28_4_ = 0x3f7ffffc;
    auVar99 = vmulps_avx512vl(auVar99,auVar114);
    auVar96 = vmulps_avx512vl(auVar96,auVar96);
    auVar102 = vrsqrt14ps_avx512vl(auVar116);
    auVar115._8_4_ = 0xbf000000;
    auVar115._0_8_ = 0xbf000000bf000000;
    auVar115._12_4_ = 0xbf000000;
    auVar115._16_4_ = 0xbf000000;
    auVar115._20_4_ = 0xbf000000;
    auVar115._24_4_ = 0xbf000000;
    auVar115._28_4_ = 0xbf000000;
    auVar107 = vmulps_avx512vl(auVar116,auVar115);
    fVar260 = auVar102._0_4_;
    fVar276 = auVar102._4_4_;
    fVar277 = auVar102._8_4_;
    fVar278 = auVar102._12_4_;
    fVar242 = auVar102._16_4_;
    fVar243 = auVar102._20_4_;
    fVar244 = auVar102._24_4_;
    auVar120._4_4_ = fVar276 * fVar276 * fVar276 * auVar107._4_4_;
    auVar120._0_4_ = fVar260 * fVar260 * fVar260 * auVar107._0_4_;
    auVar120._8_4_ = fVar277 * fVar277 * fVar277 * auVar107._8_4_;
    auVar120._12_4_ = fVar278 * fVar278 * fVar278 * auVar107._12_4_;
    auVar120._16_4_ = fVar242 * fVar242 * fVar242 * auVar107._16_4_;
    auVar120._20_4_ = fVar243 * fVar243 * fVar243 * auVar107._20_4_;
    auVar120._24_4_ = fVar244 * fVar244 * fVar244 * auVar107._24_4_;
    auVar120._28_4_ = auVar117._28_4_;
    auVar116._8_4_ = 0x3fc00000;
    auVar116._0_8_ = 0x3fc000003fc00000;
    auVar116._12_4_ = 0x3fc00000;
    auVar116._16_4_ = 0x3fc00000;
    auVar116._20_4_ = 0x3fc00000;
    auVar116._24_4_ = 0x3fc00000;
    auVar116._28_4_ = 0x3fc00000;
    auVar102 = vfmadd231ps_avx512vl(auVar120,auVar102,auVar116);
    auVar107 = vmulps_avx512vl(auVar97,auVar102);
    auVar114 = vmulps_avx512vl(auVar100,auVar102);
    auVar115 = vmulps_avx512vl(auVar101,auVar102);
    auVar116 = vsubps_avx512vl(auVar132,auVar103);
    auVar117 = vsubps_avx512vl(auVar132,auVar104);
    auVar118 = vsubps_avx512vl(auVar132,auVar105);
    auVar119 = vmulps_avx512vl(local_820,auVar118);
    auVar119 = vfmadd231ps_avx512vl(auVar119,local_800,auVar117);
    auVar119 = vfmadd231ps_avx512vl(auVar119,_local_7e0,auVar116);
    auVar120 = vmulps_avx512vl(auVar118,auVar118);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar117,auVar117);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar116,auVar116);
    auVar121 = vmulps_avx512vl(local_820,auVar115);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar114,local_800);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar107,_local_7e0);
    auVar115 = vmulps_avx512vl(auVar118,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar117,auVar114);
    auVar107 = vfmadd231ps_avx512vl(auVar114,auVar116,auVar107);
    auVar114 = vmulps_avx512vl(auVar121,auVar121);
    auVar115 = vsubps_avx512vl(local_560,auVar114);
    auVar122 = vmulps_avx512vl(auVar121,auVar107);
    auVar119 = vsubps_avx512vl(auVar119,auVar122);
    auVar119 = vaddps_avx512vl(auVar119,auVar119);
    auVar122 = vmulps_avx512vl(auVar107,auVar107);
    local_a00 = vsubps_avx512vl(auVar120,auVar122);
    auVar96 = vsubps_avx512vl(local_a00,auVar96);
    auVar120 = vmulps_avx512vl(auVar119,auVar119);
    auVar122 = vmulps_avx512vl(auVar115,auVar98);
    auVar123 = vmulps_avx512vl(auVar122,auVar96);
    auVar123 = vsubps_avx512vl(auVar120,auVar123);
    auVar75 = vxorps_avx512vl(auVar98._0_16_,auVar98._0_16_);
    uVar66 = vcmpps_avx512vl(auVar123,auVar132,5);
    bVar53 = (byte)uVar66;
    if (bVar53 != 0) {
      local_7c0._0_32_ = auVar120;
      auVar123 = vsqrtps_avx512vl(auVar123);
      auVar124 = vaddps_avx512vl(auVar115,auVar115);
      _local_860 = vrcp14ps_avx512vl(auVar124);
      auVar98._8_4_ = 0x3f800000;
      auVar98._0_8_ = 0x3f8000003f800000;
      auVar98._12_4_ = 0x3f800000;
      auVar98._16_4_ = 0x3f800000;
      auVar98._20_4_ = 0x3f800000;
      auVar98._24_4_ = 0x3f800000;
      auVar98._28_4_ = 0x3f800000;
      auVar98 = vfnmadd213ps_avx512vl(_local_860,auVar124,auVar98);
      auVar98 = vfmadd132ps_avx512vl(auVar98,_local_860,_local_860);
      local_880 = vxorps_avx512vl(auVar119,auVar106);
      auVar106 = vsubps_avx512vl(local_880,auVar123);
      auVar106 = vmulps_avx512vl(auVar106,auVar98);
      auVar123 = vsubps_avx512vl(auVar123,auVar119);
      local_840 = vmulps_avx512vl(auVar123,auVar98);
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar123 = vblendmps_avx512vl(auVar98,auVar106);
      auVar125._0_4_ =
           (uint)(bVar53 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar98._0_4_;
      bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar125._4_4_ = (uint)bVar65 * auVar123._4_4_ | (uint)!bVar65 * auVar98._4_4_;
      bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar125._8_4_ = (uint)bVar65 * auVar123._8_4_ | (uint)!bVar65 * auVar98._8_4_;
      bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar125._12_4_ = (uint)bVar65 * auVar123._12_4_ | (uint)!bVar65 * auVar98._12_4_;
      bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar125._16_4_ = (uint)bVar65 * auVar123._16_4_ | (uint)!bVar65 * auVar98._16_4_;
      bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar125._20_4_ = (uint)bVar65 * auVar123._20_4_ | (uint)!bVar65 * auVar98._20_4_;
      bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar125._24_4_ = (uint)bVar65 * auVar123._24_4_ | (uint)!bVar65 * auVar98._24_4_;
      bVar65 = SUB81(uVar66 >> 7,0);
      auVar125._28_4_ = (uint)bVar65 * auVar123._28_4_ | (uint)!bVar65 * auVar98._28_4_;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar123 = vblendmps_avx512vl(auVar98,local_840);
      auVar126._0_4_ =
           (uint)(bVar53 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar98._0_4_;
      bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar65 * auVar123._4_4_ | (uint)!bVar65 * auVar98._4_4_;
      bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar65 * auVar123._8_4_ | (uint)!bVar65 * auVar98._8_4_;
      bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar65 * auVar123._12_4_ | (uint)!bVar65 * auVar98._12_4_;
      bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar126._16_4_ = (uint)bVar65 * auVar123._16_4_ | (uint)!bVar65 * auVar98._16_4_;
      bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar126._20_4_ = (uint)bVar65 * auVar123._20_4_ | (uint)!bVar65 * auVar98._20_4_;
      bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar126._24_4_ = (uint)bVar65 * auVar123._24_4_ | (uint)!bVar65 * auVar98._24_4_;
      bVar65 = SUB81(uVar66 >> 7,0);
      auVar126._28_4_ = (uint)bVar65 * auVar123._28_4_ | (uint)!bVar65 * auVar98._28_4_;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar114,auVar98);
      local_8a0 = vmaxps_avx512vl(local_580,auVar98);
      auVar132._8_4_ = 0x36000000;
      auVar132._0_8_ = 0x3600000036000000;
      auVar132._12_4_ = 0x36000000;
      auVar132._16_4_ = 0x36000000;
      auVar132._20_4_ = 0x36000000;
      auVar132._24_4_ = 0x36000000;
      auVar132._28_4_ = 0x36000000;
      local_8c0 = vmulps_avx512vl(local_8a0,auVar132);
      vandps_avx512vl(auVar115,auVar98);
      uVar20 = vcmpps_avx512vl(local_8c0,local_8c0,1);
      uVar66 = uVar66 & uVar20;
      bVar57 = (byte)uVar66;
      if (bVar57 != 0) {
        uVar20 = vcmpps_avx512vl(auVar96,ZEXT1632(auVar75),2);
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar115 = vblendmps_avx512vl(auVar96,auVar114);
        bVar58 = (byte)uVar20;
        uVar68 = (uint)(bVar58 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar58 & 1) * local_8c0._0_4_;
        bVar65 = (bool)((byte)(uVar20 >> 1) & 1);
        uVar67 = (uint)bVar65 * auVar115._4_4_ | (uint)!bVar65 * local_8c0._4_4_;
        bVar65 = (bool)((byte)(uVar20 >> 2) & 1);
        uVar143 = (uint)bVar65 * auVar115._8_4_ | (uint)!bVar65 * local_8c0._8_4_;
        bVar65 = (bool)((byte)(uVar20 >> 3) & 1);
        uVar144 = (uint)bVar65 * auVar115._12_4_ | (uint)!bVar65 * local_8c0._12_4_;
        bVar65 = (bool)((byte)(uVar20 >> 4) & 1);
        uVar145 = (uint)bVar65 * auVar115._16_4_ | (uint)!bVar65 * local_8c0._16_4_;
        bVar65 = (bool)((byte)(uVar20 >> 5) & 1);
        uVar146 = (uint)bVar65 * auVar115._20_4_ | (uint)!bVar65 * local_8c0._20_4_;
        bVar65 = (bool)((byte)(uVar20 >> 6) & 1);
        uVar147 = (uint)bVar65 * auVar115._24_4_ | (uint)!bVar65 * local_8c0._24_4_;
        bVar65 = SUB81(uVar20 >> 7,0);
        uVar148 = (uint)bVar65 * auVar115._28_4_ | (uint)!bVar65 * local_8c0._28_4_;
        auVar125._0_4_ = (bVar57 & 1) * uVar68 | !(bool)(bVar57 & 1) * auVar125._0_4_;
        bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar125._4_4_ = bVar65 * uVar67 | !bVar65 * auVar125._4_4_;
        bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar125._8_4_ = bVar65 * uVar143 | !bVar65 * auVar125._8_4_;
        bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar125._12_4_ = bVar65 * uVar144 | !bVar65 * auVar125._12_4_;
        bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar125._16_4_ = bVar65 * uVar145 | !bVar65 * auVar125._16_4_;
        bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar125._20_4_ = bVar65 * uVar146 | !bVar65 * auVar125._20_4_;
        bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar125._24_4_ = bVar65 * uVar147 | !bVar65 * auVar125._24_4_;
        bVar65 = SUB81(uVar66 >> 7,0);
        auVar125._28_4_ = bVar65 * uVar148 | !bVar65 * auVar125._28_4_;
        auVar96 = vblendmps_avx512vl(auVar114,auVar96);
        bVar65 = (bool)((byte)(uVar20 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar20 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar20 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar20 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar20 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar20 >> 6) & 1);
        bVar14 = SUB81(uVar20 >> 7,0);
        auVar126._0_4_ =
             (uint)(bVar57 & 1) *
             ((uint)(bVar58 & 1) * auVar96._0_4_ | !(bool)(bVar58 & 1) * uVar68) |
             !(bool)(bVar57 & 1) * auVar126._0_4_;
        bVar8 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar126._4_4_ =
             (uint)bVar8 * ((uint)bVar65 * auVar96._4_4_ | !bVar65 * uVar67) |
             !bVar8 * auVar126._4_4_;
        bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar126._8_4_ =
             (uint)bVar65 * ((uint)bVar9 * auVar96._8_4_ | !bVar9 * uVar143) |
             !bVar65 * auVar126._8_4_;
        bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar126._12_4_ =
             (uint)bVar65 * ((uint)bVar10 * auVar96._12_4_ | !bVar10 * uVar144) |
             !bVar65 * auVar126._12_4_;
        bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar126._16_4_ =
             (uint)bVar65 * ((uint)bVar11 * auVar96._16_4_ | !bVar11 * uVar145) |
             !bVar65 * auVar126._16_4_;
        bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar126._20_4_ =
             (uint)bVar65 * ((uint)bVar12 * auVar96._20_4_ | !bVar12 * uVar146) |
             !bVar65 * auVar126._20_4_;
        bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar126._24_4_ =
             (uint)bVar65 * ((uint)bVar13 * auVar96._24_4_ | !bVar13 * uVar147) |
             !bVar65 * auVar126._24_4_;
        bVar65 = SUB81(uVar66 >> 7,0);
        auVar126._28_4_ =
             (uint)bVar65 * ((uint)bVar14 * auVar96._28_4_ | !bVar14 * uVar148) |
             !bVar65 * auVar126._28_4_;
        bVar53 = (~bVar57 | bVar58) & bVar53;
      }
      if ((bVar53 & 0x7f) != 0) {
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar113 = vxorps_avx512vl(auVar113,auVar98);
        auVar111 = vxorps_avx512vl(auVar111,auVar98);
        uVar68 = *(uint *)(ray + k * 4 + 0x200);
        auVar112 = vxorps_avx512vl(auVar112,auVar98);
        auVar75 = vsubss_avx512f(ZEXT416(uVar68),ZEXT416((uint)local_930._0_4_));
        auVar96 = vbroadcastss_avx512vl(auVar75);
        auVar123 = vminps_avx512vl(auVar96,auVar126);
        auVar52._4_4_ = fStack_61c;
        auVar52._0_4_ = local_620;
        auVar52._8_4_ = fStack_618;
        auVar52._12_4_ = fStack_614;
        auVar52._16_4_ = fStack_610;
        auVar52._20_4_ = fStack_60c;
        auVar52._24_4_ = fStack_608;
        auVar52._28_4_ = fStack_604;
        auVar96 = vmaxps_avx512vl(auVar52,auVar125);
        auVar114 = vmulps_avx512vl(auVar129,auVar118);
        auVar114 = vfmadd213ps_avx512vl(auVar117,auVar128,auVar114);
        auVar75 = vfmadd213ps_fma(auVar116,auVar127,auVar114);
        auVar114 = vmulps_avx512vl(local_820,auVar129);
        auVar114 = vfmadd231ps_avx512vl(auVar114,local_800,auVar128);
        auVar76 = vfmadd231ps_fma(auVar114,_local_7e0,auVar127);
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar76),auVar116);
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar19 = vcmpps_avx512vl(auVar116,auVar117,1);
        auVar114 = vxorps_avx512vl(ZEXT1632(auVar75),auVar98);
        auVar115 = vrcp14ps_avx512vl(ZEXT1632(auVar76));
        auVar132 = ZEXT1632(auVar76);
        auVar118 = vxorps_avx512vl(auVar132,auVar98);
        auVar127 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar128 = vfnmadd213ps_avx512vl(auVar115,auVar132,auVar127);
        auVar75 = vfmadd132ps_fma(auVar128,auVar115,auVar115);
        fVar260 = auVar75._0_4_ * auVar114._0_4_;
        fVar276 = auVar75._4_4_ * auVar114._4_4_;
        auVar36._4_4_ = fVar276;
        auVar36._0_4_ = fVar260;
        fVar277 = auVar75._8_4_ * auVar114._8_4_;
        auVar36._8_4_ = fVar277;
        fVar278 = auVar75._12_4_ * auVar114._12_4_;
        auVar36._12_4_ = fVar278;
        fVar242 = auVar114._16_4_ * 0.0;
        auVar36._16_4_ = fVar242;
        fVar243 = auVar114._20_4_ * 0.0;
        auVar36._20_4_ = fVar243;
        fVar244 = auVar114._24_4_ * 0.0;
        auVar36._24_4_ = fVar244;
        auVar36._28_4_ = auVar114._28_4_;
        uVar21 = vcmpps_avx512vl(auVar132,auVar118,1);
        bVar57 = (byte)uVar19 | (byte)uVar21;
        auVar128 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar129 = vblendmps_avx512vl(auVar36,auVar128);
        auVar130._0_4_ =
             (uint)(bVar57 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar115._0_4_;
        bVar65 = (bool)(bVar57 >> 1 & 1);
        auVar130._4_4_ = (uint)bVar65 * auVar129._4_4_ | (uint)!bVar65 * auVar115._4_4_;
        bVar65 = (bool)(bVar57 >> 2 & 1);
        auVar130._8_4_ = (uint)bVar65 * auVar129._8_4_ | (uint)!bVar65 * auVar115._8_4_;
        bVar65 = (bool)(bVar57 >> 3 & 1);
        auVar130._12_4_ = (uint)bVar65 * auVar129._12_4_ | (uint)!bVar65 * auVar115._12_4_;
        bVar65 = (bool)(bVar57 >> 4 & 1);
        auVar130._16_4_ = (uint)bVar65 * auVar129._16_4_ | (uint)!bVar65 * auVar115._16_4_;
        bVar65 = (bool)(bVar57 >> 5 & 1);
        auVar130._20_4_ = (uint)bVar65 * auVar129._20_4_ | (uint)!bVar65 * auVar115._20_4_;
        bVar65 = (bool)(bVar57 >> 6 & 1);
        auVar130._24_4_ = (uint)bVar65 * auVar129._24_4_ | (uint)!bVar65 * auVar115._24_4_;
        auVar130._28_4_ =
             (uint)(bVar57 >> 7) * auVar129._28_4_ | (uint)!(bool)(bVar57 >> 7) * auVar115._28_4_;
        auVar129 = vmaxps_avx512vl(auVar96,auVar130);
        auVar288 = ZEXT3264(auVar129);
        uVar21 = vcmpps_avx512vl(auVar132,auVar118,6);
        bVar57 = (byte)uVar19 | (byte)uVar21;
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar131._0_4_ =
             (uint)(bVar57 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar57 & 1) * (int)fVar260;
        bVar65 = (bool)(bVar57 >> 1 & 1);
        auVar131._4_4_ = (uint)bVar65 * auVar118._4_4_ | (uint)!bVar65 * (int)fVar276;
        bVar65 = (bool)(bVar57 >> 2 & 1);
        auVar131._8_4_ = (uint)bVar65 * auVar118._8_4_ | (uint)!bVar65 * (int)fVar277;
        bVar65 = (bool)(bVar57 >> 3 & 1);
        auVar131._12_4_ = (uint)bVar65 * auVar118._12_4_ | (uint)!bVar65 * (int)fVar278;
        bVar65 = (bool)(bVar57 >> 4 & 1);
        auVar131._16_4_ = (uint)bVar65 * auVar118._16_4_ | (uint)!bVar65 * (int)fVar242;
        bVar65 = (bool)(bVar57 >> 5 & 1);
        auVar131._20_4_ = (uint)bVar65 * auVar118._20_4_ | (uint)!bVar65 * (int)fVar243;
        bVar65 = (bool)(bVar57 >> 6 & 1);
        auVar131._24_4_ = (uint)bVar65 * auVar118._24_4_ | (uint)!bVar65 * (int)fVar244;
        auVar131._28_4_ =
             (uint)(bVar57 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar57 >> 7) * auVar114._28_4_;
        auVar132 = vminps_avx512vl(auVar123,auVar131);
        auVar96 = vsubps_avx(ZEXT832(0) << 0x20,auVar108);
        auVar114 = vsubps_avx(ZEXT832(0) << 0x20,auVar109);
        auVar109 = ZEXT832(0) << 0x20;
        auVar115 = vsubps_avx(auVar109,auVar110);
        auVar115 = vmulps_avx512vl(auVar115,auVar113);
        auVar114 = vfmadd231ps_avx512vl(auVar115,auVar112,auVar114);
        auVar96 = vfmadd231ps_avx512vl(auVar114,auVar111,auVar96);
        auVar114 = vmulps_avx512vl(local_820,auVar113);
        auVar114 = vfmadd231ps_avx512vl(auVar114,local_800,auVar112);
        auVar114 = vfmadd231ps_avx512vl(auVar114,_local_7e0,auVar111);
        vandps_avx512vl(auVar114,auVar116);
        uVar19 = vcmpps_avx512vl(auVar114,auVar117,1);
        auVar96 = vxorps_avx512vl(auVar96,auVar98);
        auVar115 = vrcp14ps_avx512vl(auVar114);
        auVar116 = vxorps_avx512vl(auVar114,auVar98);
        auVar283 = ZEXT3264(auVar116);
        auVar108 = vfnmadd213ps_avx512vl(auVar115,auVar114,auVar127);
        auVar75 = vfmadd132ps_fma(auVar108,auVar115,auVar115);
        fVar260 = auVar75._0_4_ * auVar96._0_4_;
        fVar276 = auVar75._4_4_ * auVar96._4_4_;
        auVar37._4_4_ = fVar276;
        auVar37._0_4_ = fVar260;
        fVar277 = auVar75._8_4_ * auVar96._8_4_;
        auVar37._8_4_ = fVar277;
        fVar278 = auVar75._12_4_ * auVar96._12_4_;
        auVar37._12_4_ = fVar278;
        fVar242 = auVar96._16_4_ * 0.0;
        auVar37._16_4_ = fVar242;
        fVar243 = auVar96._20_4_ * 0.0;
        auVar37._20_4_ = fVar243;
        fVar244 = auVar96._24_4_ * 0.0;
        auVar37._24_4_ = fVar244;
        auVar37._28_4_ = auVar96._28_4_;
        uVar21 = vcmpps_avx512vl(auVar114,auVar116,1);
        bVar57 = (byte)uVar19 | (byte)uVar21;
        auVar108 = vblendmps_avx512vl(auVar37,auVar128);
        auVar133._0_4_ =
             (uint)(bVar57 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar115._0_4_;
        bVar65 = (bool)(bVar57 >> 1 & 1);
        auVar133._4_4_ = (uint)bVar65 * auVar108._4_4_ | (uint)!bVar65 * auVar115._4_4_;
        bVar65 = (bool)(bVar57 >> 2 & 1);
        auVar133._8_4_ = (uint)bVar65 * auVar108._8_4_ | (uint)!bVar65 * auVar115._8_4_;
        bVar65 = (bool)(bVar57 >> 3 & 1);
        auVar133._12_4_ = (uint)bVar65 * auVar108._12_4_ | (uint)!bVar65 * auVar115._12_4_;
        bVar65 = (bool)(bVar57 >> 4 & 1);
        auVar133._16_4_ = (uint)bVar65 * auVar108._16_4_ | (uint)!bVar65 * auVar115._16_4_;
        bVar65 = (bool)(bVar57 >> 5 & 1);
        auVar133._20_4_ = (uint)bVar65 * auVar108._20_4_ | (uint)!bVar65 * auVar115._20_4_;
        bVar65 = (bool)(bVar57 >> 6 & 1);
        auVar133._24_4_ = (uint)bVar65 * auVar108._24_4_ | (uint)!bVar65 * auVar115._24_4_;
        auVar133._28_4_ =
             (uint)(bVar57 >> 7) * auVar108._28_4_ | (uint)!(bool)(bVar57 >> 7) * auVar115._28_4_;
        auVar281 = ZEXT3264(auVar133);
        _local_a20 = vmaxps_avx(auVar129,auVar133);
        auVar275 = ZEXT3264(_local_a20);
        uVar21 = vcmpps_avx512vl(auVar114,auVar116,6);
        bVar57 = (byte)uVar19 | (byte)uVar21;
        auVar134._0_4_ =
             (uint)(bVar57 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar57 & 1) * (int)fVar260;
        bVar65 = (bool)(bVar57 >> 1 & 1);
        auVar134._4_4_ = (uint)bVar65 * auVar118._4_4_ | (uint)!bVar65 * (int)fVar276;
        bVar65 = (bool)(bVar57 >> 2 & 1);
        auVar134._8_4_ = (uint)bVar65 * auVar118._8_4_ | (uint)!bVar65 * (int)fVar277;
        bVar65 = (bool)(bVar57 >> 3 & 1);
        auVar134._12_4_ = (uint)bVar65 * auVar118._12_4_ | (uint)!bVar65 * (int)fVar278;
        bVar65 = (bool)(bVar57 >> 4 & 1);
        auVar134._16_4_ = (uint)bVar65 * auVar118._16_4_ | (uint)!bVar65 * (int)fVar242;
        bVar65 = (bool)(bVar57 >> 5 & 1);
        auVar134._20_4_ = (uint)bVar65 * auVar118._20_4_ | (uint)!bVar65 * (int)fVar243;
        bVar65 = (bool)(bVar57 >> 6 & 1);
        auVar134._24_4_ = (uint)bVar65 * auVar118._24_4_ | (uint)!bVar65 * (int)fVar244;
        auVar134._28_4_ =
             (uint)(bVar57 >> 7) * auVar118._28_4_ | (uint)!(bool)(bVar57 >> 7) * auVar96._28_4_;
        local_680 = vminps_avx(auVar132,auVar134);
        auVar280 = ZEXT3264(local_680);
        uVar19 = vcmpps_avx512vl(_local_a20,local_680,2);
        bVar53 = bVar53 & 0x7f & (byte)uVar19;
        if (bVar53 != 0) {
          auVar99 = vmaxps_avx(auVar109,auVar99);
          auVar96 = vfmadd213ps_avx512vl(auVar106,auVar121,auVar107);
          fVar260 = auVar102._0_4_;
          fVar276 = auVar102._4_4_;
          auVar38._4_4_ = fVar276 * auVar96._4_4_;
          auVar38._0_4_ = fVar260 * auVar96._0_4_;
          fVar277 = auVar102._8_4_;
          auVar38._8_4_ = fVar277 * auVar96._8_4_;
          fVar278 = auVar102._12_4_;
          auVar38._12_4_ = fVar278 * auVar96._12_4_;
          fVar242 = auVar102._16_4_;
          auVar38._16_4_ = fVar242 * auVar96._16_4_;
          fVar243 = auVar102._20_4_;
          auVar38._20_4_ = fVar243 * auVar96._20_4_;
          fVar244 = auVar102._24_4_;
          auVar38._24_4_ = fVar244 * auVar96._24_4_;
          auVar38._28_4_ = auVar96._28_4_;
          auVar96 = vfmadd213ps_avx512vl(local_840,auVar121,auVar107);
          auVar39._4_4_ = fVar276 * auVar96._4_4_;
          auVar39._0_4_ = fVar260 * auVar96._0_4_;
          auVar39._8_4_ = fVar277 * auVar96._8_4_;
          auVar39._12_4_ = fVar278 * auVar96._12_4_;
          auVar39._16_4_ = fVar242 * auVar96._16_4_;
          auVar39._20_4_ = fVar243 * auVar96._20_4_;
          auVar39._24_4_ = fVar244 * auVar96._24_4_;
          auVar39._28_4_ = auVar133._28_4_;
          auVar96 = vminps_avx512vl(auVar38,auVar127);
          auVar114 = ZEXT832(0) << 0x20;
          auVar96 = vmaxps_avx(auVar96,ZEXT832(0) << 0x20);
          auVar115 = vminps_avx512vl(auVar39,auVar127);
          auVar40._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
          auVar40._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
          auVar40._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
          auVar40._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
          auVar40._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
          auVar40._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
          auVar40._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
          auVar40._28_4_ = auVar96._28_4_ + 7.0;
          local_520 = vfmadd213ps_avx512vl(auVar40,auVar162,auVar251);
          auVar96 = vmaxps_avx(auVar115,ZEXT832(0) << 0x20);
          auVar41._4_4_ = (auVar96._4_4_ + 1.0) * 0.125;
          auVar41._0_4_ = (auVar96._0_4_ + 0.0) * 0.125;
          auVar41._8_4_ = (auVar96._8_4_ + 2.0) * 0.125;
          auVar41._12_4_ = (auVar96._12_4_ + 3.0) * 0.125;
          auVar41._16_4_ = (auVar96._16_4_ + 4.0) * 0.125;
          auVar41._20_4_ = (auVar96._20_4_ + 5.0) * 0.125;
          auVar41._24_4_ = (auVar96._24_4_ + 6.0) * 0.125;
          auVar41._28_4_ = auVar96._28_4_ + 7.0;
          local_540 = vfmadd213ps_avx512vl(auVar41,auVar162,auVar251);
          auVar42._4_4_ = auVar99._4_4_ * auVar99._4_4_;
          auVar42._0_4_ = auVar99._0_4_ * auVar99._0_4_;
          auVar42._8_4_ = auVar99._8_4_ * auVar99._8_4_;
          auVar42._12_4_ = auVar99._12_4_ * auVar99._12_4_;
          auVar42._16_4_ = auVar99._16_4_ * auVar99._16_4_;
          auVar42._20_4_ = auVar99._20_4_ * auVar99._20_4_;
          auVar42._24_4_ = auVar99._24_4_ * auVar99._24_4_;
          auVar42._28_4_ = auVar99._28_4_;
          auVar96 = vsubps_avx(local_a00,auVar42);
          local_ac0 = auVar122._0_4_;
          fStack_abc = auVar122._4_4_;
          fStack_ab8 = auVar122._8_4_;
          fStack_ab4 = auVar122._12_4_;
          fStack_ab0 = auVar122._16_4_;
          fStack_aac = auVar122._20_4_;
          fStack_aa8 = auVar122._24_4_;
          auVar43._4_4_ = auVar96._4_4_ * fStack_abc;
          auVar43._0_4_ = auVar96._0_4_ * local_ac0;
          auVar43._8_4_ = auVar96._8_4_ * fStack_ab8;
          auVar43._12_4_ = auVar96._12_4_ * fStack_ab4;
          auVar43._16_4_ = auVar96._16_4_ * fStack_ab0;
          auVar43._20_4_ = auVar96._20_4_ * fStack_aac;
          auVar43._24_4_ = auVar96._24_4_ * fStack_aa8;
          auVar43._28_4_ = auVar99._28_4_;
          auVar99 = vsubps_avx(auVar120,auVar43);
          uVar19 = vcmpps_avx512vl(auVar99,ZEXT832(0) << 0x20,5);
          bVar57 = (byte)uVar19;
          if (bVar57 == 0) {
            bVar57 = 0;
            auVar97 = ZEXT832(0) << 0x20;
            auVar169 = ZEXT864(0) << 0x20;
            auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar115 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar281 = ZEXT864(0) << 0x20;
            auVar124._8_4_ = 0x7f800000;
            auVar124._0_8_ = 0x7f8000007f800000;
            auVar124._12_4_ = 0x7f800000;
            auVar124._16_4_ = 0x7f800000;
            auVar124._20_4_ = 0x7f800000;
            auVar124._24_4_ = 0x7f800000;
            auVar124._28_4_ = 0x7f800000;
            auVar135._8_4_ = 0xff800000;
            auVar135._0_8_ = 0xff800000ff800000;
            auVar135._12_4_ = 0xff800000;
            auVar135._16_4_ = 0xff800000;
            auVar135._20_4_ = 0xff800000;
            auVar135._24_4_ = 0xff800000;
            auVar135._28_4_ = 0xff800000;
          }
          else {
            auVar76 = vxorps_avx512vl(auVar123._0_16_,auVar123._0_16_);
            uVar66 = vcmpps_avx512vl(auVar99,auVar109,5);
            auVar99 = vsqrtps_avx(auVar99);
            auVar114 = vfnmadd213ps_avx512vl(auVar124,_local_860,auVar127);
            auVar116 = vfmadd132ps_avx512vl(auVar114,_local_860,_local_860);
            auVar114 = vsubps_avx(local_880,auVar99);
            auVar106 = vmulps_avx512vl(auVar114,auVar116);
            auVar99 = vsubps_avx512vl(auVar99,auVar119);
            auVar116 = vmulps_avx512vl(auVar99,auVar116);
            auVar99 = vfmadd213ps_avx512vl(auVar121,auVar106,auVar107);
            auVar44._4_4_ = fVar276 * auVar99._4_4_;
            auVar44._0_4_ = fVar260 * auVar99._0_4_;
            auVar44._8_4_ = fVar277 * auVar99._8_4_;
            auVar44._12_4_ = fVar278 * auVar99._12_4_;
            auVar44._16_4_ = fVar242 * auVar99._16_4_;
            auVar44._20_4_ = fVar243 * auVar99._20_4_;
            auVar44._24_4_ = fVar244 * auVar99._24_4_;
            auVar44._28_4_ = auVar115._28_4_;
            auVar45._4_4_ = (float)local_7e0._4_4_ * auVar106._4_4_;
            auVar45._0_4_ = (float)local_7e0._0_4_ * auVar106._0_4_;
            auVar45._8_4_ = fStack_7d8 * auVar106._8_4_;
            auVar45._12_4_ = fStack_7d4 * auVar106._12_4_;
            auVar45._16_4_ = fStack_7d0 * auVar106._16_4_;
            auVar45._20_4_ = fStack_7cc * auVar106._20_4_;
            auVar45._24_4_ = fStack_7c8 * auVar106._24_4_;
            auVar45._28_4_ = auVar99._28_4_;
            auVar114 = vmulps_avx512vl(local_800,auVar106);
            auVar108 = vmulps_avx512vl(local_820,auVar106);
            auVar99 = vfmadd213ps_avx512vl(auVar97,auVar44,auVar103);
            auVar99 = vsubps_avx512vl(auVar45,auVar99);
            auVar115 = vfmadd213ps_avx512vl(auVar100,auVar44,auVar104);
            auVar115 = vsubps_avx512vl(auVar114,auVar115);
            auVar75 = vfmadd213ps_fma(auVar44,auVar101,auVar105);
            auVar114 = vsubps_avx(auVar108,ZEXT1632(auVar75));
            auVar281 = ZEXT3264(auVar114);
            auVar107 = vfmadd213ps_avx512vl(auVar121,auVar116,auVar107);
            auVar102 = vmulps_avx512vl(auVar102,auVar107);
            auVar46._4_4_ = (float)local_7e0._4_4_ * auVar116._4_4_;
            auVar46._0_4_ = (float)local_7e0._0_4_ * auVar116._0_4_;
            auVar46._8_4_ = fStack_7d8 * auVar116._8_4_;
            auVar46._12_4_ = fStack_7d4 * auVar116._12_4_;
            auVar46._16_4_ = fStack_7d0 * auVar116._16_4_;
            auVar46._20_4_ = fStack_7cc * auVar116._20_4_;
            auVar46._24_4_ = fStack_7c8 * auVar116._24_4_;
            auVar46._28_4_ = auVar108._28_4_;
            auVar107 = vmulps_avx512vl(local_800,auVar116);
            auVar108 = vmulps_avx512vl(local_820,auVar116);
            auVar75 = vfmadd213ps_fma(auVar97,auVar102,auVar103);
            auVar114 = vsubps_avx(auVar46,ZEXT1632(auVar75));
            auVar75 = vfmadd213ps_fma(auVar100,auVar102,auVar104);
            auVar97 = vsubps_avx512vl(auVar107,ZEXT1632(auVar75));
            auVar75 = vfmadd213ps_fma(auVar101,auVar102,auVar105);
            auVar100 = vsubps_avx512vl(auVar108,ZEXT1632(auVar75));
            auVar169 = ZEXT3264(auVar100);
            auVar163._8_4_ = 0x7f800000;
            auVar163._0_8_ = 0x7f8000007f800000;
            auVar163._12_4_ = 0x7f800000;
            auVar163._16_4_ = 0x7f800000;
            auVar163._20_4_ = 0x7f800000;
            auVar163._24_4_ = 0x7f800000;
            auVar163._28_4_ = 0x7f800000;
            auVar100 = vblendmps_avx512vl(auVar163,auVar106);
            bVar65 = (bool)((byte)uVar66 & 1);
            auVar124._0_4_ = (uint)bVar65 * auVar100._0_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar124._4_4_ = (uint)bVar65 * auVar100._4_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar124._8_4_ = (uint)bVar65 * auVar100._8_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar124._12_4_ = (uint)bVar65 * auVar100._12_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar124._16_4_ = (uint)bVar65 * auVar100._16_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar124._20_4_ = (uint)bVar65 * auVar100._20_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar124._24_4_ = (uint)bVar65 * auVar100._24_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = SUB81(uVar66 >> 7,0);
            auVar124._28_4_ = (uint)bVar65 * auVar100._28_4_ | (uint)!bVar65 * 0x7f800000;
            auVar222._8_4_ = 0xff800000;
            auVar222._0_8_ = 0xff800000ff800000;
            auVar222._12_4_ = 0xff800000;
            auVar222._16_4_ = 0xff800000;
            auVar222._20_4_ = 0xff800000;
            auVar222._24_4_ = 0xff800000;
            auVar222._28_4_ = 0xff800000;
            auVar100 = vblendmps_avx512vl(auVar222,auVar116);
            bVar65 = (bool)((byte)uVar66 & 1);
            auVar135._0_4_ = (uint)bVar65 * auVar100._0_4_ | (uint)!bVar65 * -0x800000;
            bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar135._4_4_ = (uint)bVar65 * auVar100._4_4_ | (uint)!bVar65 * -0x800000;
            bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar135._8_4_ = (uint)bVar65 * auVar100._8_4_ | (uint)!bVar65 * -0x800000;
            bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar135._12_4_ = (uint)bVar65 * auVar100._12_4_ | (uint)!bVar65 * -0x800000;
            bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar135._16_4_ = (uint)bVar65 * auVar100._16_4_ | (uint)!bVar65 * -0x800000;
            bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar135._20_4_ = (uint)bVar65 * auVar100._20_4_ | (uint)!bVar65 * -0x800000;
            bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar135._24_4_ = (uint)bVar65 * auVar100._24_4_ | (uint)!bVar65 * -0x800000;
            bVar65 = SUB81(uVar66 >> 7,0);
            auVar135._28_4_ = (uint)bVar65 * auVar100._28_4_ | (uint)!bVar65 * -0x800000;
            auVar32._8_4_ = 0x36000000;
            auVar32._0_8_ = 0x3600000036000000;
            auVar32._12_4_ = 0x36000000;
            auVar32._16_4_ = 0x36000000;
            auVar32._20_4_ = 0x36000000;
            auVar32._24_4_ = 0x36000000;
            auVar32._28_4_ = 0x36000000;
            auVar100 = vmulps_avx512vl(local_8a0,auVar32);
            uVar20 = vcmpps_avx512vl(auVar100,local_8c0,0xe);
            uVar66 = uVar66 & uVar20;
            bVar58 = (byte)uVar66;
            if (bVar58 != 0) {
              uVar20 = vcmpps_avx512vl(auVar96,ZEXT1632(auVar76),2);
              auVar270._8_4_ = 0x7f800000;
              auVar270._0_8_ = 0x7f8000007f800000;
              auVar270._12_4_ = 0x7f800000;
              auVar270._16_4_ = 0x7f800000;
              auVar270._20_4_ = 0x7f800000;
              auVar270._24_4_ = 0x7f800000;
              auVar270._28_4_ = 0x7f800000;
              auVar287._8_4_ = 0xff800000;
              auVar287._0_8_ = 0xff800000ff800000;
              auVar287._12_4_ = 0xff800000;
              auVar287._16_4_ = 0xff800000;
              auVar287._20_4_ = 0xff800000;
              auVar287._24_4_ = 0xff800000;
              auVar287._28_4_ = 0xff800000;
              auVar96 = vblendmps_avx512vl(auVar270,auVar287);
              bVar62 = (byte)uVar20;
              uVar67 = (uint)(bVar62 & 1) * auVar96._0_4_ |
                       (uint)!(bool)(bVar62 & 1) * auVar100._0_4_;
              bVar65 = (bool)((byte)(uVar20 >> 1) & 1);
              uVar143 = (uint)bVar65 * auVar96._4_4_ | (uint)!bVar65 * auVar100._4_4_;
              bVar65 = (bool)((byte)(uVar20 >> 2) & 1);
              uVar144 = (uint)bVar65 * auVar96._8_4_ | (uint)!bVar65 * auVar100._8_4_;
              bVar65 = (bool)((byte)(uVar20 >> 3) & 1);
              uVar145 = (uint)bVar65 * auVar96._12_4_ | (uint)!bVar65 * auVar100._12_4_;
              bVar65 = (bool)((byte)(uVar20 >> 4) & 1);
              uVar146 = (uint)bVar65 * auVar96._16_4_ | (uint)!bVar65 * auVar100._16_4_;
              bVar65 = (bool)((byte)(uVar20 >> 5) & 1);
              uVar147 = (uint)bVar65 * auVar96._20_4_ | (uint)!bVar65 * auVar100._20_4_;
              bVar65 = (bool)((byte)(uVar20 >> 6) & 1);
              uVar148 = (uint)bVar65 * auVar96._24_4_ | (uint)!bVar65 * auVar100._24_4_;
              bVar65 = SUB81(uVar20 >> 7,0);
              uVar149 = (uint)bVar65 * auVar96._28_4_ | (uint)!bVar65 * auVar100._28_4_;
              auVar124._0_4_ = (bVar58 & 1) * uVar67 | !(bool)(bVar58 & 1) * auVar124._0_4_;
              bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
              auVar124._4_4_ = bVar65 * uVar143 | !bVar65 * auVar124._4_4_;
              bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
              auVar124._8_4_ = bVar65 * uVar144 | !bVar65 * auVar124._8_4_;
              bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
              auVar124._12_4_ = bVar65 * uVar145 | !bVar65 * auVar124._12_4_;
              bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
              auVar124._16_4_ = bVar65 * uVar146 | !bVar65 * auVar124._16_4_;
              bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
              auVar124._20_4_ = bVar65 * uVar147 | !bVar65 * auVar124._20_4_;
              bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
              auVar124._24_4_ = bVar65 * uVar148 | !bVar65 * auVar124._24_4_;
              bVar65 = SUB81(uVar66 >> 7,0);
              auVar124._28_4_ = bVar65 * uVar149 | !bVar65 * auVar124._28_4_;
              auVar96 = vblendmps_avx512vl(auVar287,auVar270);
              bVar65 = (bool)((byte)(uVar20 >> 1) & 1);
              bVar9 = (bool)((byte)(uVar20 >> 2) & 1);
              bVar10 = (bool)((byte)(uVar20 >> 3) & 1);
              bVar11 = (bool)((byte)(uVar20 >> 4) & 1);
              bVar12 = (bool)((byte)(uVar20 >> 5) & 1);
              bVar13 = (bool)((byte)(uVar20 >> 6) & 1);
              bVar14 = SUB81(uVar20 >> 7,0);
              auVar135._0_4_ =
                   (uint)(bVar58 & 1) *
                   ((uint)(bVar62 & 1) * auVar96._0_4_ | !(bool)(bVar62 & 1) * uVar67) |
                   !(bool)(bVar58 & 1) * auVar135._0_4_;
              bVar8 = (bool)((byte)(uVar66 >> 1) & 1);
              auVar135._4_4_ =
                   (uint)bVar8 * ((uint)bVar65 * auVar96._4_4_ | !bVar65 * uVar143) |
                   !bVar8 * auVar135._4_4_;
              bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
              auVar135._8_4_ =
                   (uint)bVar65 * ((uint)bVar9 * auVar96._8_4_ | !bVar9 * uVar144) |
                   !bVar65 * auVar135._8_4_;
              bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
              auVar135._12_4_ =
                   (uint)bVar65 * ((uint)bVar10 * auVar96._12_4_ | !bVar10 * uVar145) |
                   !bVar65 * auVar135._12_4_;
              bVar65 = (bool)((byte)(uVar66 >> 4) & 1);
              auVar135._16_4_ =
                   (uint)bVar65 * ((uint)bVar11 * auVar96._16_4_ | !bVar11 * uVar146) |
                   !bVar65 * auVar135._16_4_;
              bVar65 = (bool)((byte)(uVar66 >> 5) & 1);
              auVar135._20_4_ =
                   (uint)bVar65 * ((uint)bVar12 * auVar96._20_4_ | !bVar12 * uVar147) |
                   !bVar65 * auVar135._20_4_;
              bVar65 = (bool)((byte)(uVar66 >> 6) & 1);
              auVar135._24_4_ =
                   (uint)bVar65 * ((uint)bVar13 * auVar96._24_4_ | !bVar13 * uVar148) |
                   !bVar65 * auVar135._24_4_;
              bVar65 = SUB81(uVar66 >> 7,0);
              auVar135._28_4_ =
                   (uint)bVar65 * ((uint)bVar14 * auVar96._28_4_ | !bVar14 * uVar149) |
                   !bVar65 * auVar135._28_4_;
              bVar57 = (~bVar58 | bVar62) & bVar57;
            }
          }
          auVar288 = ZEXT3264(local_820);
          auVar271._0_4_ = local_820._0_4_ * auVar169._0_4_;
          auVar271._4_4_ = local_820._4_4_ * auVar169._4_4_;
          auVar271._8_4_ = local_820._8_4_ * auVar169._8_4_;
          auVar271._12_4_ = local_820._12_4_ * auVar169._12_4_;
          auVar271._16_4_ = local_820._16_4_ * auVar169._16_4_;
          auVar271._20_4_ = local_820._20_4_ * auVar169._20_4_;
          auVar271._28_36_ = auVar169._28_36_;
          auVar271._24_4_ = local_820._24_4_ * auVar169._24_4_;
          auVar275 = ZEXT3264(local_800);
          auVar75 = vfmadd231ps_fma(auVar271._0_32_,local_800,auVar97);
          auVar271 = ZEXT3264(_local_7e0);
          auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),_local_7e0,auVar114);
          auVar265._8_4_ = 0x7fffffff;
          auVar265._0_8_ = 0x7fffffff7fffffff;
          auVar265._12_4_ = 0x7fffffff;
          auVar265._16_4_ = 0x7fffffff;
          auVar265._20_4_ = 0x7fffffff;
          auVar265._24_4_ = 0x7fffffff;
          auVar265._28_4_ = 0x7fffffff;
          auVar96 = vandps_avx(ZEXT1632(auVar75),auVar265);
          auVar283 = ZEXT3264(_local_a20);
          _local_440 = _local_a20;
          auVar259._8_4_ = 0x3e99999a;
          auVar259._0_8_ = 0x3e99999a3e99999a;
          auVar259._12_4_ = 0x3e99999a;
          auVar259._16_4_ = 0x3e99999a;
          auVar259._20_4_ = 0x3e99999a;
          auVar259._24_4_ = 0x3e99999a;
          auVar259._28_4_ = 0x3e99999a;
          uVar19 = vcmpps_avx512vl(auVar96,auVar259,1);
          local_720._0_2_ = (short)uVar19;
          local_6a0 = vmaxps_avx(_local_a20,auVar135);
          auVar96 = vminps_avx(local_680,auVar124);
          uVar19 = vcmpps_avx512vl(_local_a20,auVar96,2);
          bVar58 = (byte)uVar19 & bVar53;
          uVar21 = vcmpps_avx512vl(local_6a0,local_680,2);
          if ((bVar53 & ((byte)uVar21 | (byte)uVar19)) != 0) {
            auVar47._4_4_ = local_820._4_4_ * auVar281._4_4_;
            auVar47._0_4_ = local_820._0_4_ * auVar281._0_4_;
            auVar47._8_4_ = local_820._8_4_ * auVar281._8_4_;
            auVar47._12_4_ = local_820._12_4_ * auVar281._12_4_;
            auVar47._16_4_ = local_820._16_4_ * auVar281._16_4_;
            auVar47._20_4_ = local_820._20_4_ * auVar281._20_4_;
            auVar47._24_4_ = local_820._24_4_ * auVar281._24_4_;
            auVar47._28_4_ = auVar96._28_4_;
            auVar75 = vfmadd213ps_fma(auVar115,local_800,auVar47);
            auVar75 = vfmadd213ps_fma(auVar99,_local_7e0,ZEXT1632(auVar75));
            auVar99 = vandps_avx(ZEXT1632(auVar75),auVar265);
            uVar19 = vcmpps_avx512vl(auVar99,auVar259,1);
            bVar62 = (byte)uVar19 | ~bVar57;
            auVar164._8_4_ = 2;
            auVar164._0_8_ = 0x200000002;
            auVar164._12_4_ = 2;
            auVar164._16_4_ = 2;
            auVar164._20_4_ = 2;
            auVar164._24_4_ = 2;
            auVar164._28_4_ = 2;
            auVar33._8_4_ = 3;
            auVar33._0_8_ = 0x300000003;
            auVar33._12_4_ = 3;
            auVar33._16_4_ = 3;
            auVar33._20_4_ = 3;
            auVar33._24_4_ = 3;
            auVar33._28_4_ = 3;
            auVar99 = vpblendmd_avx512vl(auVar164,auVar33);
            local_640._0_4_ = (uint)(bVar62 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar62 & 1) * 2;
            bVar65 = (bool)(bVar62 >> 1 & 1);
            local_640._4_4_ = (uint)bVar65 * auVar99._4_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar62 >> 2 & 1);
            local_640._8_4_ = (uint)bVar65 * auVar99._8_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar62 >> 3 & 1);
            local_640._12_4_ = (uint)bVar65 * auVar99._12_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar62 >> 4 & 1);
            local_640._16_4_ = (uint)bVar65 * auVar99._16_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar62 >> 5 & 1);
            local_640._20_4_ = (uint)bVar65 * auVar99._20_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar62 >> 6 & 1);
            local_640._24_4_ = (uint)bVar65 * auVar99._24_4_ | (uint)!bVar65 * 2;
            local_640._28_4_ = (uint)(bVar62 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar62 >> 7) * 2
            ;
            local_6c0 = vpbroadcastd_avx512vl();
            uVar19 = vpcmpd_avx512vl(local_6c0,local_640,5);
            bVar62 = (byte)uVar19 & bVar58;
            if (bVar62 == 0) {
              auVar166._4_4_ = uVar68;
              auVar166._0_4_ = uVar68;
              auVar166._8_4_ = uVar68;
              auVar166._12_4_ = uVar68;
              auVar166._16_4_ = uVar68;
              auVar166._20_4_ = uVar68;
              auVar166._24_4_ = uVar68;
              auVar166._28_4_ = uVar68;
              auVar99 = local_6a0;
            }
            else {
              local_660 = local_6a0;
              auVar76 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar75 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar17 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
              auVar18 = vminps_avx(auVar76,auVar17);
              auVar76 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
              auVar17 = vmaxps_avx(auVar75,auVar76);
              auVar202._8_4_ = 0x7fffffff;
              auVar202._0_8_ = 0x7fffffff7fffffff;
              auVar202._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx(auVar18,auVar202);
              auVar76 = vandps_avx(auVar17,auVar202);
              auVar75 = vmaxps_avx(auVar75,auVar76);
              auVar76 = vmovshdup_avx(auVar75);
              auVar76 = vmaxss_avx(auVar76,auVar75);
              auVar75 = vshufpd_avx(auVar75,auVar75,1);
              auVar75 = vmaxss_avx(auVar75,auVar76);
              fVar260 = auVar75._0_4_ * 1.9073486e-06;
              local_920 = vshufps_avx(auVar17,auVar17,0xff);
              local_700 = (float)local_a20._0_4_ + fVar172;
              fStack_6fc = (float)local_a20._4_4_ + fVar172;
              fStack_6f8 = fStack_a18 + fVar172;
              fStack_6f4 = fStack_a14 + fVar172;
              fStack_6f0 = fStack_a10 + fVar172;
              fStack_6ec = fStack_a0c + fVar172;
              fStack_6e8 = fStack_a08 + fVar172;
              fStack_6e4 = fStack_a04 + fVar172;
              do {
                auVar165._8_4_ = 0x7f800000;
                auVar165._0_8_ = 0x7f8000007f800000;
                auVar165._12_4_ = 0x7f800000;
                auVar165._16_4_ = 0x7f800000;
                auVar165._20_4_ = 0x7f800000;
                auVar165._24_4_ = 0x7f800000;
                auVar165._28_4_ = 0x7f800000;
                auVar99 = vblendmps_avx512vl(auVar165,_local_a20);
                auVar136._0_4_ =
                     (uint)(bVar62 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
                bVar65 = (bool)(bVar62 >> 1 & 1);
                auVar136._4_4_ = (uint)bVar65 * auVar99._4_4_ | (uint)!bVar65 * 0x7f800000;
                bVar65 = (bool)(bVar62 >> 2 & 1);
                auVar136._8_4_ = (uint)bVar65 * auVar99._8_4_ | (uint)!bVar65 * 0x7f800000;
                bVar65 = (bool)(bVar62 >> 3 & 1);
                auVar136._12_4_ = (uint)bVar65 * auVar99._12_4_ | (uint)!bVar65 * 0x7f800000;
                bVar65 = (bool)(bVar62 >> 4 & 1);
                auVar136._16_4_ = (uint)bVar65 * auVar99._16_4_ | (uint)!bVar65 * 0x7f800000;
                bVar65 = (bool)(bVar62 >> 5 & 1);
                auVar136._20_4_ = (uint)bVar65 * auVar99._20_4_ | (uint)!bVar65 * 0x7f800000;
                auVar136._24_4_ =
                     (uint)(bVar62 >> 6) * auVar99._24_4_ | (uint)!(bool)(bVar62 >> 6) * 0x7f800000;
                auVar136._28_4_ = 0x7f800000;
                auVar99 = vshufps_avx(auVar136,auVar136,0xb1);
                auVar99 = vminps_avx(auVar136,auVar99);
                auVar96 = vshufpd_avx(auVar99,auVar99,5);
                auVar99 = vminps_avx(auVar99,auVar96);
                auVar96 = vpermpd_avx2(auVar99,0x4e);
                auVar99 = vminps_avx(auVar99,auVar96);
                uVar19 = vcmpps_avx512vl(auVar136,auVar99,0);
                bVar54 = (byte)uVar19 & bVar62;
                bVar55 = bVar62;
                if (bVar54 != 0) {
                  bVar55 = bVar54;
                }
                iVar23 = 0;
                for (uVar68 = (uint)bVar55; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
                  iVar23 = iVar23 + 1;
                }
                uVar68 = *(uint *)(local_520 + (uint)(iVar23 << 2));
                uVar67 = *(uint *)(local_440 + (uint)(iVar23 << 2));
                fVar276 = auVar72._0_4_;
                if ((float)local_9e0._0_4_ < 0.0) {
                  fVar276 = sqrtf((float)local_9e0._0_4_);
                }
                auVar75 = vinsertps_avx(ZEXT416(uVar67),ZEXT416(uVar68),0x10);
                auVar280 = ZEXT1664(auVar75);
                bVar65 = true;
                uVar66 = 0;
                do {
                  uVar178 = auVar280._0_4_;
                  auVar155._4_4_ = uVar178;
                  auVar155._0_4_ = uVar178;
                  auVar155._8_4_ = uVar178;
                  auVar155._12_4_ = uVar178;
                  auVar75 = vfmadd132ps_fma(auVar155,ZEXT816(0) << 0x40,local_9d0);
                  auVar76 = vmovshdup_avx(auVar280._0_16_);
                  fVar252 = auVar76._0_4_;
                  fVar292 = 1.0 - fVar252;
                  fVar278 = fVar292 * fVar292 * fVar292;
                  fVar244 = fVar252 * fVar252 * fVar252;
                  auVar17 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar278),
                                            ZEXT416((uint)fVar244));
                  fVar277 = fVar252 * fVar292;
                  auVar248 = ZEXT416((uint)fVar292);
                  auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar277 * fVar252 * 6.0)),
                                            ZEXT416((uint)(fVar277 * fVar292)),
                                            SUB6416(ZEXT464(0x41400000),0));
                  auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar244),
                                            ZEXT416((uint)fVar278));
                  auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar277 * fVar292 * 6.0)),
                                            SUB6416(ZEXT464(0x41400000),0),
                                            ZEXT416((uint)(fVar277 * fVar252)));
                  fVar278 = fVar278 * 0.16666667;
                  fVar242 = (auVar17._0_4_ + auVar77._0_4_) * 0.16666667;
                  fVar243 = (auVar18._0_4_ + auVar74._0_4_) * 0.16666667;
                  fVar244 = fVar244 * 0.16666667;
                  auVar203._0_4_ = fVar244 * (float)local_9c0._0_4_;
                  auVar203._4_4_ = fVar244 * (float)local_9c0._4_4_;
                  auVar203._8_4_ = fVar244 * fStack_9b8;
                  auVar203._12_4_ = fVar244 * fStack_9b4;
                  auVar249._4_4_ = fVar243;
                  auVar249._0_4_ = fVar243;
                  auVar249._8_4_ = fVar243;
                  auVar249._12_4_ = fVar243;
                  auVar17 = vfmadd132ps_fma(auVar249,auVar203,local_980._0_16_);
                  auVar204._4_4_ = fVar242;
                  auVar204._0_4_ = fVar242;
                  auVar204._8_4_ = fVar242;
                  auVar204._12_4_ = fVar242;
                  auVar17 = vfmadd132ps_fma(auVar204,auVar17,local_9a0._0_16_);
                  auVar182._4_4_ = fVar278;
                  auVar182._0_4_ = fVar278;
                  auVar182._8_4_ = fVar278;
                  auVar182._12_4_ = fVar278;
                  auVar17 = vfmadd132ps_fma(auVar182,auVar17,local_960._0_16_);
                  local_840._0_16_ = auVar17;
                  auVar17 = vsubps_avx(auVar75,auVar17);
                  auVar75 = vdpps_avx(auVar17,auVar17,0x7f);
                  local_a00._0_16_ = auVar75;
                  local_7c0 = auVar280;
                  if (auVar75._0_4_ < 0.0) {
                    auVar275._0_4_ = sqrtf(auVar75._0_4_);
                    auVar275._4_60_ = extraout_var;
                    auVar75 = auVar275._0_16_;
                  }
                  else {
                    auVar75 = vsqrtss_avx(auVar75,auVar75);
                  }
                  local_860._4_4_ = fVar292;
                  local_860._0_4_ = fVar292;
                  fStack_858 = fVar292;
                  fStack_854 = fVar292;
                  auVar77 = vfnmsub213ss_fma(auVar76,auVar76,ZEXT416((uint)(fVar277 * 4.0)));
                  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar277 * 4.0)),auVar248,auVar248);
                  fVar277 = fVar292 * -fVar292 * 0.5;
                  fVar278 = auVar77._0_4_ * 0.5;
                  fVar242 = auVar18._0_4_ * 0.5;
                  fVar243 = fVar252 * fVar252 * 0.5;
                  auVar232._0_4_ = fVar243 * (float)local_9c0._0_4_;
                  auVar232._4_4_ = fVar243 * (float)local_9c0._4_4_;
                  auVar232._8_4_ = fVar243 * fStack_9b8;
                  auVar232._12_4_ = fVar243 * fStack_9b4;
                  auVar183._4_4_ = fVar242;
                  auVar183._0_4_ = fVar242;
                  auVar183._8_4_ = fVar242;
                  auVar183._12_4_ = fVar242;
                  auVar18 = vfmadd132ps_fma(auVar183,auVar232,local_980._0_16_);
                  auVar205._4_4_ = fVar278;
                  auVar205._0_4_ = fVar278;
                  auVar205._8_4_ = fVar278;
                  auVar205._12_4_ = fVar278;
                  auVar18 = vfmadd132ps_fma(auVar205,auVar18,local_9a0._0_16_);
                  auVar285._4_4_ = fVar277;
                  auVar285._0_4_ = fVar277;
                  auVar285._8_4_ = fVar277;
                  auVar285._12_4_ = fVar277;
                  auVar18 = vfmadd132ps_fma(auVar285,auVar18,local_960._0_16_);
                  local_880._0_16_ = vdpps_avx(auVar18,auVar18,0x7f);
                  auVar48._12_4_ = 0;
                  auVar48._0_12_ = ZEXT812(0);
                  fVar277 = local_880._0_4_;
                  auVar77 = vrsqrt14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar277));
                  fVar278 = auVar77._0_4_;
                  local_8a0._0_16_ = vrcp14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar277));
                  auVar77 = vfnmadd213ss_fma(local_8a0._0_16_,local_880._0_16_,ZEXT416(0x40000000));
                  local_8c0._0_4_ = auVar77._0_4_;
                  uVar68 = auVar75._0_4_;
                  if (fVar277 < -fVar277) {
                    fVar242 = sqrtf(fVar277);
                    auVar75 = ZEXT416(uVar68);
                  }
                  else {
                    auVar77 = vsqrtss_avx(local_880._0_16_,local_880._0_16_);
                    fVar242 = auVar77._0_4_;
                  }
                  fVar277 = fVar278 * 1.5 + fVar277 * -0.5 * fVar278 * fVar278 * fVar278;
                  auVar156._0_4_ = auVar18._0_4_ * fVar277;
                  auVar156._4_4_ = auVar18._4_4_ * fVar277;
                  auVar156._8_4_ = auVar18._8_4_ * fVar277;
                  auVar156._12_4_ = auVar18._12_4_ * fVar277;
                  auVar77 = vdpps_avx(auVar17,auVar156,0x7f);
                  fVar244 = auVar75._0_4_;
                  fVar278 = auVar77._0_4_;
                  auVar157._0_4_ = fVar278 * fVar278;
                  auVar157._4_4_ = auVar77._4_4_ * auVar77._4_4_;
                  auVar157._8_4_ = auVar77._8_4_ * auVar77._8_4_;
                  auVar157._12_4_ = auVar77._12_4_ * auVar77._12_4_;
                  auVar74 = vsubps_avx(local_a00._0_16_,auVar157);
                  fVar243 = auVar74._0_4_;
                  auVar184._4_12_ = ZEXT812(0) << 0x20;
                  auVar184._0_4_ = fVar243;
                  auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar184);
                  auVar79 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
                  auVar80 = vmulss_avx512f(auVar74,ZEXT416(0xbf000000));
                  if (fVar243 < 0.0) {
                    local_8e0._0_4_ = fVar242;
                    local_900._0_4_ = auVar79._0_4_;
                    local_910._4_4_ = fVar277;
                    local_910._0_4_ = fVar277;
                    fStack_908 = fVar277;
                    fStack_904 = fVar277;
                    local_8f0 = auVar78;
                    fVar243 = sqrtf(fVar243);
                    auVar80 = ZEXT416(auVar80._0_4_);
                    auVar79 = ZEXT416((uint)local_900._0_4_);
                    auVar75 = ZEXT416(uVar68);
                    auVar78 = local_8f0;
                    fVar277 = (float)local_910._0_4_;
                    fVar292 = (float)local_910._4_4_;
                    fVar252 = fStack_908;
                    fVar293 = fStack_904;
                    fVar242 = (float)local_8e0._0_4_;
                  }
                  else {
                    auVar74 = vsqrtss_avx(auVar74,auVar74);
                    fVar243 = auVar74._0_4_;
                    fVar292 = fVar277;
                    fVar252 = fVar277;
                    fVar293 = fVar277;
                  }
                  auVar288 = ZEXT1664(auVar18);
                  auVar283 = ZEXT1664(local_a00._0_16_);
                  auVar281 = ZEXT1664(auVar17);
                  auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar248,auVar76);
                  auVar248 = vfmadd213ss_fma(auVar76,SUB6416(ZEXT464(0xc0000000),0),auVar248);
                  auVar83 = local_7c0._0_16_;
                  auVar76 = vshufps_avx(auVar83,auVar83,0x55);
                  auVar206._0_4_ = auVar76._0_4_ * (float)local_9c0._0_4_;
                  auVar206._4_4_ = auVar76._4_4_ * (float)local_9c0._4_4_;
                  auVar206._8_4_ = auVar76._8_4_ * fStack_9b8;
                  auVar206._12_4_ = auVar76._12_4_ * fStack_9b4;
                  auVar233._0_4_ = auVar248._0_4_;
                  auVar233._4_4_ = auVar233._0_4_;
                  auVar233._8_4_ = auVar233._0_4_;
                  auVar233._12_4_ = auVar233._0_4_;
                  auVar76 = vfmadd132ps_fma(auVar233,auVar206,local_980._0_16_);
                  auVar185._0_4_ = auVar74._0_4_;
                  auVar185._4_4_ = auVar185._0_4_;
                  auVar185._8_4_ = auVar185._0_4_;
                  auVar185._12_4_ = auVar185._0_4_;
                  auVar76 = vfmadd132ps_fma(auVar185,auVar76,local_9a0._0_16_);
                  auVar76 = vfmadd132ps_fma(_local_860,auVar76,local_960._0_16_);
                  auVar186._0_4_ = auVar76._0_4_ * (float)local_880._0_4_;
                  auVar186._4_4_ = auVar76._4_4_ * (float)local_880._0_4_;
                  auVar186._8_4_ = auVar76._8_4_ * (float)local_880._0_4_;
                  auVar186._12_4_ = auVar76._12_4_ * (float)local_880._0_4_;
                  auVar76 = vdpps_avx(auVar18,auVar76,0x7f);
                  fVar198 = auVar76._0_4_;
                  auVar207._0_4_ = auVar18._0_4_ * fVar198;
                  auVar207._4_4_ = auVar18._4_4_ * fVar198;
                  auVar207._8_4_ = auVar18._8_4_ * fVar198;
                  auVar207._12_4_ = auVar18._12_4_ * fVar198;
                  auVar76 = vsubps_avx(auVar186,auVar207);
                  fVar198 = (float)local_8c0._0_4_ * (float)local_8a0._0_4_;
                  auVar248 = vmaxss_avx(ZEXT416((uint)fVar260),
                                        ZEXT416((uint)(local_7c0._0_4_ * fVar276 * 1.9073486e-06)));
                  auVar25._8_4_ = 0x80000000;
                  auVar25._0_8_ = 0x8000000080000000;
                  auVar25._12_4_ = 0x80000000;
                  auVar81 = vxorps_avx512vl(auVar18,auVar25);
                  auVar208._0_4_ = fVar277 * auVar76._0_4_ * fVar198;
                  auVar208._4_4_ = fVar292 * auVar76._4_4_ * fVar198;
                  auVar208._8_4_ = fVar252 * auVar76._8_4_ * fVar198;
                  auVar208._12_4_ = fVar293 * auVar76._12_4_ * fVar198;
                  auVar76 = vdpps_avx(auVar81,auVar156,0x7f);
                  auVar74 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar260),auVar248);
                  auVar75 = vdpps_avx(auVar17,auVar208,0x7f);
                  auVar82 = vfmadd213ss_fma(ZEXT416((uint)(fVar244 + 1.0)),
                                            ZEXT416((uint)(fVar260 / fVar242)),auVar74);
                  fVar277 = auVar76._0_4_ + auVar75._0_4_;
                  auVar75 = vdpps_avx(local_9d0,auVar156,0x7f);
                  auVar76 = vdpps_avx(auVar17,auVar81,0x7f);
                  auVar74 = vmulss_avx512f(auVar80,auVar78);
                  auVar80 = vaddss_avx512f(auVar79,ZEXT416((uint)(auVar74._0_4_ *
                                                                 auVar78._0_4_ * auVar78._0_4_)));
                  auVar74 = vdpps_avx(auVar17,local_9d0,0x7f);
                  auVar79 = vfnmadd231ss_fma(auVar76,auVar77,ZEXT416((uint)fVar277));
                  auVar74 = vfnmadd231ss_fma(auVar74,auVar77,auVar75);
                  auVar76 = vpermilps_avx(local_840._0_16_,0xff);
                  fVar243 = fVar243 - auVar76._0_4_;
                  auVar78 = vshufps_avx(auVar18,auVar18,0xff);
                  auVar76 = vfmsub213ss_fma(auVar79,auVar80,auVar78);
                  auVar273._8_4_ = 0x80000000;
                  auVar273._0_8_ = 0x8000000080000000;
                  auVar273._12_4_ = 0x80000000;
                  auVar275 = ZEXT1664(auVar273);
                  auVar268._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                  auVar268._8_4_ = auVar76._8_4_ ^ 0x80000000;
                  auVar268._12_4_ = auVar76._12_4_ ^ 0x80000000;
                  auVar271 = ZEXT1664(auVar268);
                  auVar74 = ZEXT416((uint)(auVar74._0_4_ * auVar80._0_4_));
                  auVar79 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar76._0_4_)),
                                            ZEXT416((uint)fVar277),auVar74);
                  auVar76 = vinsertps_avx(auVar268,auVar74,0x1c);
                  auVar257._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
                  auVar257._8_4_ = auVar75._8_4_ ^ 0x80000000;
                  auVar257._12_4_ = auVar75._12_4_ ^ 0x80000000;
                  auVar74 = vinsertps_avx(ZEXT416((uint)fVar277),auVar257,0x10);
                  auVar234._0_4_ = auVar79._0_4_;
                  auVar234._4_4_ = auVar234._0_4_;
                  auVar234._8_4_ = auVar234._0_4_;
                  auVar234._12_4_ = auVar234._0_4_;
                  auVar75 = vdivps_avx(auVar76,auVar234);
                  auVar76 = vdivps_avx(auVar74,auVar234);
                  auVar235._0_4_ = fVar278 * auVar75._0_4_ + fVar243 * auVar76._0_4_;
                  auVar235._4_4_ = fVar278 * auVar75._4_4_ + fVar243 * auVar76._4_4_;
                  auVar235._8_4_ = fVar278 * auVar75._8_4_ + fVar243 * auVar76._8_4_;
                  auVar235._12_4_ = fVar278 * auVar75._12_4_ + fVar243 * auVar76._12_4_;
                  auVar75 = vsubps_avx(auVar83,auVar235);
                  auVar280 = ZEXT1664(auVar75);
                  auVar26._8_4_ = 0x7fffffff;
                  auVar26._0_8_ = 0x7fffffff7fffffff;
                  auVar26._12_4_ = 0x7fffffff;
                  auVar76 = vandps_avx512vl(auVar77,auVar26);
                  if (auVar76._0_4_ < auVar82._0_4_) {
                    auVar76 = vfmadd231ss_fma(ZEXT416((uint)(auVar82._0_4_ + auVar248._0_4_)),
                                              local_920,ZEXT416(0x36000000));
                    auVar27._8_4_ = 0x7fffffff;
                    auVar27._0_8_ = 0x7fffffff7fffffff;
                    auVar27._12_4_ = 0x7fffffff;
                    auVar77 = vandps_avx512vl(ZEXT416((uint)fVar243),auVar27);
                    if (auVar77._0_4_ < auVar76._0_4_) {
                      fVar276 = auVar75._0_4_ + (float)local_930._0_4_;
                      if (fVar276 < fVar170) {
LAB_01bae822:
                        bVar55 = 0;
                        goto LAB_01bae847;
                      }
                      fVar277 = *(float *)(ray + k * 4 + 0x200);
                      if (fVar276 <= fVar277) {
                        auVar76 = vmovshdup_avx(auVar75);
                        bVar55 = 0;
                        if ((auVar76._0_4_ < 0.0) || (1.0 < auVar76._0_4_)) goto LAB_01bae847;
                        auVar236._0_12_ = ZEXT812(0);
                        auVar236._12_4_ = 0;
                        auVar209._4_8_ = auVar236._4_8_;
                        auVar209._0_4_ = local_a00._0_4_;
                        auVar209._12_4_ = 0;
                        auVar76 = vrsqrt14ss_avx512f(auVar236,auVar209);
                        fVar278 = auVar76._0_4_;
                        pGVar3 = (context->scene->geometries).items[uVar59].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) goto LAB_01bae822;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar55 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01bae847;
                        fVar278 = fVar278 * 1.5 +
                                  local_a00._0_4_ * -0.5 * fVar278 * fVar278 * fVar278;
                        auVar210._0_4_ = auVar17._0_4_ * fVar278;
                        auVar210._4_4_ = auVar17._4_4_ * fVar278;
                        auVar210._8_4_ = auVar17._8_4_ * fVar278;
                        auVar210._12_4_ = auVar17._12_4_ * fVar278;
                        auVar248 = vfmadd213ps_fma(auVar78,auVar210,auVar18);
                        auVar76 = vshufps_avx(auVar210,auVar210,0xc9);
                        auVar77 = vshufps_avx(auVar18,auVar18,0xc9);
                        auVar211._0_4_ = auVar210._0_4_ * auVar77._0_4_;
                        auVar211._4_4_ = auVar210._4_4_ * auVar77._4_4_;
                        auVar211._8_4_ = auVar210._8_4_ * auVar77._8_4_;
                        auVar211._12_4_ = auVar210._12_4_ * auVar77._12_4_;
                        auVar74 = vfmsub231ps_fma(auVar211,auVar18,auVar76);
                        auVar76 = vshufps_avx(auVar74,auVar74,0xc9);
                        auVar77 = vshufps_avx(auVar248,auVar248,0xc9);
                        auVar74 = vshufps_avx(auVar74,auVar74,0xd2);
                        auVar158._0_4_ = auVar248._0_4_ * auVar74._0_4_;
                        auVar158._4_4_ = auVar248._4_4_ * auVar74._4_4_;
                        auVar158._8_4_ = auVar248._8_4_ * auVar74._8_4_;
                        auVar158._12_4_ = auVar248._12_4_ * auVar74._12_4_;
                        auVar76 = vfmsub231ps_fma(auVar158,auVar76,auVar77);
                        auVar169 = vbroadcastss_avx512f(ZEXT416(1));
                        local_340 = vpermps_avx512f(auVar169,auVar280);
                        auVar169 = vpermps_avx512f(auVar169,ZEXT1664(auVar76));
                        auVar141 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar141,ZEXT1664(auVar76));
                        local_380 = vbroadcastss_avx512f(auVar76);
                        local_400[0] = (RTCHitN)auVar169[0];
                        local_400[1] = (RTCHitN)auVar169[1];
                        local_400[2] = (RTCHitN)auVar169[2];
                        local_400[3] = (RTCHitN)auVar169[3];
                        local_400[4] = (RTCHitN)auVar169[4];
                        local_400[5] = (RTCHitN)auVar169[5];
                        local_400[6] = (RTCHitN)auVar169[6];
                        local_400[7] = (RTCHitN)auVar169[7];
                        local_400[8] = (RTCHitN)auVar169[8];
                        local_400[9] = (RTCHitN)auVar169[9];
                        local_400[10] = (RTCHitN)auVar169[10];
                        local_400[0xb] = (RTCHitN)auVar169[0xb];
                        local_400[0xc] = (RTCHitN)auVar169[0xc];
                        local_400[0xd] = (RTCHitN)auVar169[0xd];
                        local_400[0xe] = (RTCHitN)auVar169[0xe];
                        local_400[0xf] = (RTCHitN)auVar169[0xf];
                        local_400[0x10] = (RTCHitN)auVar169[0x10];
                        local_400[0x11] = (RTCHitN)auVar169[0x11];
                        local_400[0x12] = (RTCHitN)auVar169[0x12];
                        local_400[0x13] = (RTCHitN)auVar169[0x13];
                        local_400[0x14] = (RTCHitN)auVar169[0x14];
                        local_400[0x15] = (RTCHitN)auVar169[0x15];
                        local_400[0x16] = (RTCHitN)auVar169[0x16];
                        local_400[0x17] = (RTCHitN)auVar169[0x17];
                        local_400[0x18] = (RTCHitN)auVar169[0x18];
                        local_400[0x19] = (RTCHitN)auVar169[0x19];
                        local_400[0x1a] = (RTCHitN)auVar169[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar169[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar169[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar169[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar169[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar169[0x1f];
                        local_400[0x20] = (RTCHitN)auVar169[0x20];
                        local_400[0x21] = (RTCHitN)auVar169[0x21];
                        local_400[0x22] = (RTCHitN)auVar169[0x22];
                        local_400[0x23] = (RTCHitN)auVar169[0x23];
                        local_400[0x24] = (RTCHitN)auVar169[0x24];
                        local_400[0x25] = (RTCHitN)auVar169[0x25];
                        local_400[0x26] = (RTCHitN)auVar169[0x26];
                        local_400[0x27] = (RTCHitN)auVar169[0x27];
                        local_400[0x28] = (RTCHitN)auVar169[0x28];
                        local_400[0x29] = (RTCHitN)auVar169[0x29];
                        local_400[0x2a] = (RTCHitN)auVar169[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar169[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar169[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar169[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar169[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar169[0x2f];
                        local_400[0x30] = (RTCHitN)auVar169[0x30];
                        local_400[0x31] = (RTCHitN)auVar169[0x31];
                        local_400[0x32] = (RTCHitN)auVar169[0x32];
                        local_400[0x33] = (RTCHitN)auVar169[0x33];
                        local_400[0x34] = (RTCHitN)auVar169[0x34];
                        local_400[0x35] = (RTCHitN)auVar169[0x35];
                        local_400[0x36] = (RTCHitN)auVar169[0x36];
                        local_400[0x37] = (RTCHitN)auVar169[0x37];
                        local_400[0x38] = (RTCHitN)auVar169[0x38];
                        local_400[0x39] = (RTCHitN)auVar169[0x39];
                        local_400[0x3a] = (RTCHitN)auVar169[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar169[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar169[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar169[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar169[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar169[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar169 = vmovdqa64_avx512f(local_4c0);
                        local_280 = vmovdqa64_avx512f(auVar169);
                        vpcmpeqd_avx2(auVar169._0_32_,auVar169._0_32_);
                        local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar276;
                        auVar169 = vmovdqa64_avx512f(local_500);
                        local_780 = vmovdqa64_avx512f(auVar169);
                        local_a50.valid = (int *)local_780;
                        local_a50.geometryUserPtr = pGVar3->userPtr;
                        local_a50.context = context->user;
                        local_a50.hit = local_400;
                        local_a50.N = 0x10;
                        local_a50.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar271 = ZEXT1664(auVar268);
                          auVar275 = ZEXT1664(auVar273);
                          auVar280 = ZEXT1664(auVar75);
                          auVar281 = ZEXT1664(auVar17);
                          auVar283 = ZEXT1664(local_a00._0_16_);
                          auVar288 = ZEXT1664(auVar18);
                          (*pGVar3->occlusionFilterN)(&local_a50);
                          auVar169 = vmovdqa64_avx512f(local_780);
                        }
                        uVar19 = vptestmd_avx512f(auVar169,auVar169);
                        if ((short)uVar19 != 0) {
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar271 = ZEXT1664(auVar271._0_16_);
                            auVar275 = ZEXT1664(auVar275._0_16_);
                            auVar280 = ZEXT1664(auVar280._0_16_);
                            auVar281 = ZEXT1664(auVar281._0_16_);
                            auVar283 = ZEXT1664(auVar283._0_16_);
                            auVar288 = ZEXT1664(auVar288._0_16_);
                            (*p_Var7)(&local_a50);
                            auVar169 = vmovdqa64_avx512f(local_780);
                          }
                          uVar66 = vptestmd_avx512f(auVar169,auVar169);
                          auVar169 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar8 = (bool)((byte)uVar66 & 1);
                          auVar141._0_4_ =
                               (uint)bVar8 * auVar169._0_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x200);
                          bVar8 = (bool)((byte)(uVar66 >> 1) & 1);
                          auVar141._4_4_ =
                               (uint)bVar8 * auVar169._4_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x204);
                          bVar8 = (bool)((byte)(uVar66 >> 2) & 1);
                          auVar141._8_4_ =
                               (uint)bVar8 * auVar169._8_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x208);
                          bVar8 = (bool)((byte)(uVar66 >> 3) & 1);
                          auVar141._12_4_ =
                               (uint)bVar8 * auVar169._12_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x20c);
                          bVar8 = (bool)((byte)(uVar66 >> 4) & 1);
                          auVar141._16_4_ =
                               (uint)bVar8 * auVar169._16_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x210);
                          bVar8 = (bool)((byte)(uVar66 >> 5) & 1);
                          auVar141._20_4_ =
                               (uint)bVar8 * auVar169._20_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x214);
                          bVar8 = (bool)((byte)(uVar66 >> 6) & 1);
                          auVar141._24_4_ =
                               (uint)bVar8 * auVar169._24_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x218);
                          bVar8 = (bool)((byte)(uVar66 >> 7) & 1);
                          auVar141._28_4_ =
                               (uint)bVar8 * auVar169._28_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x21c);
                          bVar8 = (bool)((byte)(uVar66 >> 8) & 1);
                          auVar141._32_4_ =
                               (uint)bVar8 * auVar169._32_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x220);
                          bVar8 = (bool)((byte)(uVar66 >> 9) & 1);
                          auVar141._36_4_ =
                               (uint)bVar8 * auVar169._36_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x224);
                          bVar8 = (bool)((byte)(uVar66 >> 10) & 1);
                          auVar141._40_4_ =
                               (uint)bVar8 * auVar169._40_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x228);
                          bVar8 = (bool)((byte)(uVar66 >> 0xb) & 1);
                          auVar141._44_4_ =
                               (uint)bVar8 * auVar169._44_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x22c);
                          bVar8 = (bool)((byte)(uVar66 >> 0xc) & 1);
                          auVar141._48_4_ =
                               (uint)bVar8 * auVar169._48_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x230);
                          bVar8 = (bool)((byte)(uVar66 >> 0xd) & 1);
                          auVar141._52_4_ =
                               (uint)bVar8 * auVar169._52_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x234);
                          bVar8 = (bool)((byte)(uVar66 >> 0xe) & 1);
                          auVar141._56_4_ =
                               (uint)bVar8 * auVar169._56_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x238);
                          bVar8 = SUB81(uVar66 >> 0xf,0);
                          auVar141._60_4_ =
                               (uint)bVar8 * auVar169._60_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x23c);
                          *(undefined1 (*) [64])(local_a50.ray + 0x200) = auVar141;
                          bVar55 = 1;
                          if ((short)uVar66 != 0) goto LAB_01bae847;
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar277;
                      }
                      bVar55 = 0;
                      goto LAB_01bae847;
                    }
                  }
                  bVar65 = uVar66 < 4;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != 5);
                bVar65 = false;
                bVar55 = 5;
LAB_01bae847:
                bVar63 = (bool)(bVar63 | bVar65 & bVar55);
                uVar178 = *(undefined4 *)(ray + k * 4 + 0x200);
                auVar166._4_4_ = uVar178;
                auVar166._0_4_ = uVar178;
                auVar166._8_4_ = uVar178;
                auVar166._12_4_ = uVar178;
                auVar166._16_4_ = uVar178;
                auVar166._20_4_ = uVar178;
                auVar166._24_4_ = uVar178;
                auVar166._28_4_ = uVar178;
                auVar50._4_4_ = fStack_6fc;
                auVar50._0_4_ = local_700;
                auVar50._8_4_ = fStack_6f8;
                auVar50._12_4_ = fStack_6f4;
                auVar50._16_4_ = fStack_6f0;
                auVar50._20_4_ = fStack_6ec;
                auVar50._24_4_ = fStack_6e8;
                auVar50._28_4_ = fStack_6e4;
                uVar19 = vcmpps_avx512vl(auVar166,auVar50,0xd);
                bVar62 = ~('\x01' << ((byte)iVar23 & 0x1f)) & bVar62 & (byte)uVar19;
                auVar99 = local_660;
              } while (bVar62 != 0);
            }
            auVar169 = ZEXT3264(local_6a0);
            bVar57 = local_720[0] | ~bVar57;
            auVar193._0_4_ = fVar172 + auVar99._0_4_;
            auVar193._4_4_ = fVar172 + auVar99._4_4_;
            auVar193._8_4_ = fVar172 + auVar99._8_4_;
            auVar193._12_4_ = fVar172 + auVar99._12_4_;
            auVar193._16_4_ = fVar172 + auVar99._16_4_;
            auVar193._20_4_ = fVar172 + auVar99._20_4_;
            auVar193._24_4_ = fVar172 + auVar99._24_4_;
            auVar193._28_4_ = fVar172 + auVar99._28_4_;
            uVar19 = vcmpps_avx512vl(auVar193,auVar166,2);
            bVar53 = (byte)uVar21 & bVar53 & (byte)uVar19;
            auVar194._8_4_ = 2;
            auVar194._0_8_ = 0x200000002;
            auVar194._12_4_ = 2;
            auVar194._16_4_ = 2;
            auVar194._20_4_ = 2;
            auVar194._24_4_ = 2;
            auVar194._28_4_ = 2;
            auVar34._8_4_ = 3;
            auVar34._0_8_ = 0x300000003;
            auVar34._12_4_ = 3;
            auVar34._16_4_ = 3;
            auVar34._20_4_ = 3;
            auVar34._24_4_ = 3;
            auVar34._28_4_ = 3;
            auVar99 = vpblendmd_avx512vl(auVar194,auVar34);
            auVar137._0_4_ = (uint)(bVar57 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar57 & 1) * 2;
            bVar65 = (bool)(bVar57 >> 1 & 1);
            auVar137._4_4_ = (uint)bVar65 * auVar99._4_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar57 >> 2 & 1);
            auVar137._8_4_ = (uint)bVar65 * auVar99._8_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar57 >> 3 & 1);
            auVar137._12_4_ = (uint)bVar65 * auVar99._12_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar57 >> 4 & 1);
            auVar137._16_4_ = (uint)bVar65 * auVar99._16_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar57 >> 5 & 1);
            auVar137._20_4_ = (uint)bVar65 * auVar99._20_4_ | (uint)!bVar65 * 2;
            bVar65 = (bool)(bVar57 >> 6 & 1);
            auVar137._24_4_ = (uint)bVar65 * auVar99._24_4_ | (uint)!bVar65 * 2;
            auVar137._28_4_ = (uint)(bVar57 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar57 >> 7) * 2;
            uVar19 = vpcmpd_avx512vl(local_6c0,auVar137,5);
            bVar57 = (byte)uVar19 & bVar53;
            if (bVar57 != 0) {
              auVar76 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar75 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar17 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
              auVar18 = vminps_avx(auVar76,auVar17);
              auVar76 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
              auVar17 = vmaxps_avx(auVar75,auVar76);
              auVar212._8_4_ = 0x7fffffff;
              auVar212._0_8_ = 0x7fffffff7fffffff;
              auVar212._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx(auVar18,auVar212);
              auVar76 = vandps_avx(auVar17,auVar212);
              auVar75 = vmaxps_avx(auVar75,auVar76);
              auVar76 = vmovshdup_avx(auVar75);
              auVar76 = vmaxss_avx(auVar76,auVar75);
              auVar75 = vshufpd_avx(auVar75,auVar75,1);
              auVar75 = vmaxss_avx(auVar75,auVar76);
              fVar260 = auVar75._0_4_ * 1.9073486e-06;
              local_920 = vshufps_avx(auVar17,auVar17,0xff);
              local_700 = fVar172 + local_6a0._0_4_;
              fStack_6fc = fVar172 + local_6a0._4_4_;
              fStack_6f8 = fVar172 + local_6a0._8_4_;
              fStack_6f4 = fVar172 + local_6a0._12_4_;
              fStack_6f0 = fVar172 + local_6a0._16_4_;
              fStack_6ec = fVar172 + local_6a0._20_4_;
              fStack_6e8 = fVar172 + local_6a0._24_4_;
              fStack_6e4 = fVar172 + local_6a0._28_4_;
              _local_a20 = local_6a0;
              local_720 = auVar137;
              do {
                auVar167._8_4_ = 0x7f800000;
                auVar167._0_8_ = 0x7f8000007f800000;
                auVar167._12_4_ = 0x7f800000;
                auVar167._16_4_ = 0x7f800000;
                auVar167._20_4_ = 0x7f800000;
                auVar167._24_4_ = 0x7f800000;
                auVar167._28_4_ = 0x7f800000;
                auVar99 = vblendmps_avx512vl(auVar167,auVar169._0_32_);
                auVar138._0_4_ =
                     (uint)(bVar57 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar57 & 1) * 0x7f800000;
                bVar65 = (bool)(bVar57 >> 1 & 1);
                auVar138._4_4_ = (uint)bVar65 * auVar99._4_4_ | (uint)!bVar65 * 0x7f800000;
                bVar65 = (bool)(bVar57 >> 2 & 1);
                auVar138._8_4_ = (uint)bVar65 * auVar99._8_4_ | (uint)!bVar65 * 0x7f800000;
                bVar65 = (bool)(bVar57 >> 3 & 1);
                auVar138._12_4_ = (uint)bVar65 * auVar99._12_4_ | (uint)!bVar65 * 0x7f800000;
                bVar65 = (bool)(bVar57 >> 4 & 1);
                auVar138._16_4_ = (uint)bVar65 * auVar99._16_4_ | (uint)!bVar65 * 0x7f800000;
                bVar65 = (bool)(bVar57 >> 5 & 1);
                auVar138._20_4_ = (uint)bVar65 * auVar99._20_4_ | (uint)!bVar65 * 0x7f800000;
                auVar138._24_4_ =
                     (uint)(bVar57 >> 6) * auVar99._24_4_ | (uint)!(bool)(bVar57 >> 6) * 0x7f800000;
                auVar138._28_4_ = 0x7f800000;
                auVar99 = vshufps_avx(auVar138,auVar138,0xb1);
                auVar99 = vminps_avx(auVar138,auVar99);
                auVar96 = vshufpd_avx(auVar99,auVar99,5);
                auVar99 = vminps_avx(auVar99,auVar96);
                auVar96 = vpermpd_avx2(auVar99,0x4e);
                auVar99 = vminps_avx(auVar99,auVar96);
                uVar19 = vcmpps_avx512vl(auVar138,auVar99,0);
                bVar55 = (byte)uVar19 & bVar57;
                bVar62 = bVar57;
                if (bVar55 != 0) {
                  bVar62 = bVar55;
                }
                iVar23 = 0;
                for (uVar68 = (uint)bVar62; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
                  iVar23 = iVar23 + 1;
                }
                uVar68 = *(uint *)(local_540 + (uint)(iVar23 << 2));
                uVar67 = *(uint *)(local_680 + (uint)(iVar23 << 2));
                fVar276 = auVar73._0_4_;
                if ((float)local_9e0._0_4_ < 0.0) {
                  fVar276 = sqrtf((float)local_9e0._0_4_);
                }
                auVar75 = vinsertps_avx(ZEXT416(uVar67),ZEXT416(uVar68),0x10);
                auVar280 = ZEXT1664(auVar75);
                bVar65 = true;
                uVar66 = 0;
                do {
                  uVar178 = auVar280._0_4_;
                  auVar159._4_4_ = uVar178;
                  auVar159._0_4_ = uVar178;
                  auVar159._8_4_ = uVar178;
                  auVar159._12_4_ = uVar178;
                  auVar75 = vfmadd132ps_fma(auVar159,ZEXT816(0) << 0x40,local_9d0);
                  auVar76 = vmovshdup_avx(auVar280._0_16_);
                  fVar252 = auVar76._0_4_;
                  fVar292 = 1.0 - fVar252;
                  fVar278 = fVar292 * fVar292 * fVar292;
                  fVar244 = fVar252 * fVar252 * fVar252;
                  auVar17 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar278),
                                            ZEXT416((uint)fVar244));
                  fVar277 = fVar252 * fVar292;
                  auVar248 = ZEXT416((uint)fVar292);
                  auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar277 * fVar252 * 6.0)),
                                            ZEXT416((uint)(fVar277 * fVar292)),
                                            SUB6416(ZEXT464(0x41400000),0));
                  auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar244),
                                            ZEXT416((uint)fVar278));
                  auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar277 * fVar292 * 6.0)),
                                            SUB6416(ZEXT464(0x41400000),0),
                                            ZEXT416((uint)(fVar277 * fVar252)));
                  fVar278 = fVar278 * 0.16666667;
                  fVar242 = (auVar17._0_4_ + auVar77._0_4_) * 0.16666667;
                  fVar243 = (auVar18._0_4_ + auVar74._0_4_) * 0.16666667;
                  fVar244 = fVar244 * 0.16666667;
                  auVar213._0_4_ = fVar244 * (float)local_9c0._0_4_;
                  auVar213._4_4_ = fVar244 * (float)local_9c0._4_4_;
                  auVar213._8_4_ = fVar244 * fStack_9b8;
                  auVar213._12_4_ = fVar244 * fStack_9b4;
                  auVar250._4_4_ = fVar243;
                  auVar250._0_4_ = fVar243;
                  auVar250._8_4_ = fVar243;
                  auVar250._12_4_ = fVar243;
                  auVar17 = vfmadd132ps_fma(auVar250,auVar213,local_980._0_16_);
                  auVar214._4_4_ = fVar242;
                  auVar214._0_4_ = fVar242;
                  auVar214._8_4_ = fVar242;
                  auVar214._12_4_ = fVar242;
                  auVar17 = vfmadd132ps_fma(auVar214,auVar17,local_9a0._0_16_);
                  auVar187._4_4_ = fVar278;
                  auVar187._0_4_ = fVar278;
                  auVar187._8_4_ = fVar278;
                  auVar187._12_4_ = fVar278;
                  auVar17 = vfmadd132ps_fma(auVar187,auVar17,local_960._0_16_);
                  local_840._0_16_ = auVar17;
                  auVar17 = vsubps_avx(auVar75,auVar17);
                  auVar75 = vdpps_avx(auVar17,auVar17,0x7f);
                  local_a00._0_16_ = auVar75;
                  local_7c0 = auVar280;
                  if (auVar75._0_4_ < 0.0) {
                    auVar280._0_4_ = sqrtf(auVar75._0_4_);
                    auVar280._4_60_ = extraout_var_00;
                    auVar75 = auVar280._0_16_;
                  }
                  else {
                    auVar75 = vsqrtss_avx(auVar75,auVar75);
                  }
                  local_860._4_4_ = fVar292;
                  local_860._0_4_ = fVar292;
                  fStack_858 = fVar292;
                  fStack_854 = fVar292;
                  auVar77 = vfnmsub213ss_fma(auVar76,auVar76,ZEXT416((uint)(fVar277 * 4.0)));
                  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar277 * 4.0)),auVar248,auVar248);
                  fVar277 = fVar292 * -fVar292 * 0.5;
                  fVar278 = auVar77._0_4_ * 0.5;
                  fVar242 = auVar18._0_4_ * 0.5;
                  fVar243 = fVar252 * fVar252 * 0.5;
                  auVar237._0_4_ = fVar243 * (float)local_9c0._0_4_;
                  auVar237._4_4_ = fVar243 * (float)local_9c0._4_4_;
                  auVar237._8_4_ = fVar243 * fStack_9b8;
                  auVar237._12_4_ = fVar243 * fStack_9b4;
                  auVar188._4_4_ = fVar242;
                  auVar188._0_4_ = fVar242;
                  auVar188._8_4_ = fVar242;
                  auVar188._12_4_ = fVar242;
                  auVar18 = vfmadd132ps_fma(auVar188,auVar237,local_980._0_16_);
                  auVar215._4_4_ = fVar278;
                  auVar215._0_4_ = fVar278;
                  auVar215._8_4_ = fVar278;
                  auVar215._12_4_ = fVar278;
                  auVar18 = vfmadd132ps_fma(auVar215,auVar18,local_9a0._0_16_);
                  auVar286._4_4_ = fVar277;
                  auVar286._0_4_ = fVar277;
                  auVar286._8_4_ = fVar277;
                  auVar286._12_4_ = fVar277;
                  auVar18 = vfmadd132ps_fma(auVar286,auVar18,local_960._0_16_);
                  local_880._0_16_ = vdpps_avx(auVar18,auVar18,0x7f);
                  auVar49._12_4_ = 0;
                  auVar49._0_12_ = ZEXT812(0);
                  fVar277 = local_880._0_4_;
                  auVar77 = vrsqrt14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar277));
                  fVar278 = auVar77._0_4_;
                  local_8a0._0_16_ = vrcp14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar277));
                  auVar77 = vfnmadd213ss_fma(local_8a0._0_16_,local_880._0_16_,ZEXT416(0x40000000));
                  local_8c0._0_4_ = auVar77._0_4_;
                  uVar68 = auVar75._0_4_;
                  if (fVar277 < -fVar277) {
                    fVar242 = sqrtf(fVar277);
                    auVar75 = ZEXT416(uVar68);
                  }
                  else {
                    auVar77 = vsqrtss_avx(local_880._0_16_,local_880._0_16_);
                    fVar242 = auVar77._0_4_;
                  }
                  auVar80 = vbroadcastss_avx512vl
                                      (ZEXT416((uint)(fVar278 * 1.5 +
                                                     fVar277 * -0.5 * fVar278 * fVar278 * fVar278)))
                  ;
                  auVar79 = vmulps_avx512vl(auVar18,auVar80);
                  auVar77 = vdpps_avx(auVar17,auVar79,0x7f);
                  fVar243 = auVar75._0_4_;
                  fVar277 = auVar77._0_4_;
                  auVar160._0_4_ = fVar277 * fVar277;
                  auVar160._4_4_ = auVar77._4_4_ * auVar77._4_4_;
                  auVar160._8_4_ = auVar77._8_4_ * auVar77._8_4_;
                  auVar160._12_4_ = auVar77._12_4_ * auVar77._12_4_;
                  auVar74 = vsubps_avx(local_a00._0_16_,auVar160);
                  fVar278 = auVar74._0_4_;
                  auVar189._4_12_ = ZEXT812(0) << 0x20;
                  auVar189._0_4_ = fVar278;
                  auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
                  auVar82 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
                  auVar81 = vmulss_avx512f(auVar74,ZEXT416(0xbf000000));
                  if (fVar278 < 0.0) {
                    local_8f0._0_4_ = auVar82._0_4_;
                    _local_910 = auVar80;
                    local_900 = auVar79;
                    local_8e0 = auVar78;
                    fVar278 = sqrtf(fVar278);
                    auVar81 = ZEXT416(auVar81._0_4_);
                    auVar82 = ZEXT416((uint)local_8f0._0_4_);
                    auVar75 = ZEXT416(uVar68);
                    auVar78 = local_8e0;
                    auVar79 = local_900;
                    auVar80 = _local_910;
                  }
                  else {
                    auVar74 = vsqrtss_avx(auVar74,auVar74);
                    fVar278 = auVar74._0_4_;
                  }
                  auVar288 = ZEXT1664(auVar18);
                  auVar283 = ZEXT1664(local_a00._0_16_);
                  auVar281 = ZEXT1664(auVar17);
                  auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar248,auVar76);
                  auVar248 = vfmadd213ss_fma(auVar76,SUB6416(ZEXT464(0xc0000000),0),auVar248);
                  auVar279 = local_7c0._0_16_;
                  auVar76 = vshufps_avx(auVar279,auVar279,0x55);
                  auVar216._0_4_ = auVar76._0_4_ * (float)local_9c0._0_4_;
                  auVar216._4_4_ = auVar76._4_4_ * (float)local_9c0._4_4_;
                  auVar216._8_4_ = auVar76._8_4_ * fStack_9b8;
                  auVar216._12_4_ = auVar76._12_4_ * fStack_9b4;
                  auVar238._0_4_ = auVar248._0_4_;
                  auVar238._4_4_ = auVar238._0_4_;
                  auVar238._8_4_ = auVar238._0_4_;
                  auVar238._12_4_ = auVar238._0_4_;
                  auVar76 = vfmadd132ps_fma(auVar238,auVar216,local_980._0_16_);
                  auVar190._0_4_ = auVar74._0_4_;
                  auVar190._4_4_ = auVar190._0_4_;
                  auVar190._8_4_ = auVar190._0_4_;
                  auVar190._12_4_ = auVar190._0_4_;
                  auVar76 = vfmadd132ps_fma(auVar190,auVar76,local_9a0._0_16_);
                  auVar76 = vfmadd132ps_fma(_local_860,auVar76,local_960._0_16_);
                  auVar191._0_4_ = auVar76._0_4_ * (float)local_880._0_4_;
                  auVar191._4_4_ = auVar76._4_4_ * (float)local_880._0_4_;
                  auVar191._8_4_ = auVar76._8_4_ * (float)local_880._0_4_;
                  auVar191._12_4_ = auVar76._12_4_ * (float)local_880._0_4_;
                  auVar76 = vdpps_avx(auVar18,auVar76,0x7f);
                  fVar244 = auVar76._0_4_;
                  auVar217._0_4_ = auVar18._0_4_ * fVar244;
                  auVar217._4_4_ = auVar18._4_4_ * fVar244;
                  auVar217._8_4_ = auVar18._8_4_ * fVar244;
                  auVar217._12_4_ = auVar18._12_4_ * fVar244;
                  auVar76 = vsubps_avx(auVar191,auVar217);
                  fVar244 = (float)local_8c0._0_4_ * (float)local_8a0._0_4_;
                  auVar248 = vmaxss_avx(ZEXT416((uint)fVar260),
                                        ZEXT416((uint)(local_7c0._0_4_ * fVar276 * 1.9073486e-06)));
                  auVar218._0_4_ = auVar76._0_4_ * fVar244;
                  auVar218._4_4_ = auVar76._4_4_ * fVar244;
                  auVar218._8_4_ = auVar76._8_4_ * fVar244;
                  auVar218._12_4_ = auVar76._12_4_ * fVar244;
                  auVar28._8_4_ = 0x80000000;
                  auVar28._0_8_ = 0x8000000080000000;
                  auVar28._12_4_ = 0x80000000;
                  auVar83 = vxorps_avx512vl(auVar18,auVar28);
                  auVar80 = vmulps_avx512vl(auVar80,auVar218);
                  auVar76 = vdpps_avx(auVar83,auVar79,0x7f);
                  auVar74 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar260),auVar248);
                  auVar75 = vdpps_avx(auVar17,auVar80,0x7f);
                  auVar80 = vfmadd213ss_fma(ZEXT416((uint)(fVar243 + 1.0)),
                                            ZEXT416((uint)(fVar260 / fVar242)),auVar74);
                  fVar242 = auVar76._0_4_ + auVar75._0_4_;
                  auVar75 = vdpps_avx(local_9d0,auVar79,0x7f);
                  auVar76 = vdpps_avx(auVar17,auVar83,0x7f);
                  auVar74 = vmulss_avx512f(auVar81,auVar78);
                  auVar82 = vaddss_avx512f(auVar82,ZEXT416((uint)(auVar74._0_4_ *
                                                                 auVar78._0_4_ * auVar78._0_4_)));
                  auVar74 = vdpps_avx(auVar17,local_9d0,0x7f);
                  auVar79 = vfnmadd231ss_fma(auVar76,auVar77,ZEXT416((uint)fVar242));
                  auVar74 = vfnmadd231ss_fma(auVar74,auVar77,auVar75);
                  auVar76 = vpermilps_avx(local_840._0_16_,0xff);
                  fVar278 = fVar278 - auVar76._0_4_;
                  auVar78 = vshufps_avx(auVar18,auVar18,0xff);
                  auVar76 = vfmsub213ss_fma(auVar79,auVar82,auVar78);
                  auVar274._8_4_ = 0x80000000;
                  auVar274._0_8_ = 0x8000000080000000;
                  auVar274._12_4_ = 0x80000000;
                  auVar275 = ZEXT1664(auVar274);
                  auVar269._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                  auVar269._8_4_ = auVar76._8_4_ ^ 0x80000000;
                  auVar269._12_4_ = auVar76._12_4_ ^ 0x80000000;
                  auVar271 = ZEXT1664(auVar269);
                  auVar74 = ZEXT416((uint)(auVar74._0_4_ * auVar82._0_4_));
                  auVar79 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar76._0_4_)),
                                            ZEXT416((uint)fVar242),auVar74);
                  auVar76 = vinsertps_avx(auVar269,auVar74,0x1c);
                  auVar258._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
                  auVar258._8_4_ = auVar75._8_4_ ^ 0x80000000;
                  auVar258._12_4_ = auVar75._12_4_ ^ 0x80000000;
                  auVar74 = vinsertps_avx(ZEXT416((uint)fVar242),auVar258,0x10);
                  auVar239._0_4_ = auVar79._0_4_;
                  auVar239._4_4_ = auVar239._0_4_;
                  auVar239._8_4_ = auVar239._0_4_;
                  auVar239._12_4_ = auVar239._0_4_;
                  auVar75 = vdivps_avx(auVar76,auVar239);
                  auVar76 = vdivps_avx(auVar74,auVar239);
                  auVar240._0_4_ = fVar277 * auVar75._0_4_ + fVar278 * auVar76._0_4_;
                  auVar240._4_4_ = fVar277 * auVar75._4_4_ + fVar278 * auVar76._4_4_;
                  auVar240._8_4_ = fVar277 * auVar75._8_4_ + fVar278 * auVar76._8_4_;
                  auVar240._12_4_ = fVar277 * auVar75._12_4_ + fVar278 * auVar76._12_4_;
                  auVar75 = vsubps_avx(auVar279,auVar240);
                  auVar280 = ZEXT1664(auVar75);
                  auVar29._8_4_ = 0x7fffffff;
                  auVar29._0_8_ = 0x7fffffff7fffffff;
                  auVar29._12_4_ = 0x7fffffff;
                  auVar76 = vandps_avx512vl(auVar77,auVar29);
                  if (auVar76._0_4_ < auVar80._0_4_) {
                    auVar76 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ + auVar248._0_4_)),
                                              local_920,ZEXT416(0x36000000));
                    auVar30._8_4_ = 0x7fffffff;
                    auVar30._0_8_ = 0x7fffffff7fffffff;
                    auVar30._12_4_ = 0x7fffffff;
                    auVar77 = vandps_avx512vl(ZEXT416((uint)fVar278),auVar30);
                    if (auVar77._0_4_ < auVar76._0_4_) {
                      fVar276 = auVar75._0_4_ + (float)local_930._0_4_;
                      if (fVar276 < fVar170) {
                        bVar62 = 0;
                        goto LAB_01baf483;
                      }
                      fVar277 = *(float *)(ray + k * 4 + 0x200);
                      auVar271 = ZEXT464((uint)fVar277);
                      auVar169 = ZEXT3264(_local_a20);
                      if (fVar276 <= fVar277) {
                        auVar76 = vmovshdup_avx(auVar75);
                        bVar62 = 0;
                        if ((auVar76._0_4_ < 0.0) || (1.0 < auVar76._0_4_)) goto LAB_01baf48c;
                        auVar241._0_12_ = ZEXT812(0);
                        auVar241._12_4_ = 0;
                        auVar219._4_8_ = auVar241._4_8_;
                        auVar219._0_4_ = local_a00._0_4_;
                        auVar219._12_4_ = 0;
                        auVar76 = vrsqrt14ss_avx512f(auVar241,auVar219);
                        fVar278 = auVar76._0_4_;
                        pGVar3 = (context->scene->geometries).items[uVar59].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                          bVar62 = 0;
                          goto LAB_01baf48c;
                        }
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar62 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01baf48c;
                        fVar278 = fVar278 * 1.5 +
                                  local_a00._0_4_ * -0.5 * fVar278 * fVar278 * fVar278;
                        auVar220._0_4_ = auVar17._0_4_ * fVar278;
                        auVar220._4_4_ = auVar17._4_4_ * fVar278;
                        auVar220._8_4_ = auVar17._8_4_ * fVar278;
                        auVar220._12_4_ = auVar17._12_4_ * fVar278;
                        auVar248 = vfmadd213ps_fma(auVar78,auVar220,auVar18);
                        auVar76 = vshufps_avx(auVar220,auVar220,0xc9);
                        auVar77 = vshufps_avx(auVar18,auVar18,0xc9);
                        auVar221._0_4_ = auVar220._0_4_ * auVar77._0_4_;
                        auVar221._4_4_ = auVar220._4_4_ * auVar77._4_4_;
                        auVar221._8_4_ = auVar220._8_4_ * auVar77._8_4_;
                        auVar221._12_4_ = auVar220._12_4_ * auVar77._12_4_;
                        auVar74 = vfmsub231ps_fma(auVar221,auVar18,auVar76);
                        auVar76 = vshufps_avx(auVar74,auVar74,0xc9);
                        auVar77 = vshufps_avx(auVar248,auVar248,0xc9);
                        auVar74 = vshufps_avx(auVar74,auVar74,0xd2);
                        auVar161._0_4_ = auVar248._0_4_ * auVar74._0_4_;
                        auVar161._4_4_ = auVar248._4_4_ * auVar74._4_4_;
                        auVar161._8_4_ = auVar248._8_4_ * auVar74._8_4_;
                        auVar161._12_4_ = auVar248._12_4_ * auVar74._12_4_;
                        auVar76 = vfmsub231ps_fma(auVar161,auVar76,auVar77);
                        auVar271 = vbroadcastss_avx512f(ZEXT416(1));
                        local_340 = vpermps_avx512f(auVar271,auVar280);
                        auVar271 = vpermps_avx512f(auVar271,ZEXT1664(auVar76));
                        auVar141 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar141,ZEXT1664(auVar76));
                        local_380 = vbroadcastss_avx512f(auVar76);
                        local_400[0] = (RTCHitN)auVar271[0];
                        local_400[1] = (RTCHitN)auVar271[1];
                        local_400[2] = (RTCHitN)auVar271[2];
                        local_400[3] = (RTCHitN)auVar271[3];
                        local_400[4] = (RTCHitN)auVar271[4];
                        local_400[5] = (RTCHitN)auVar271[5];
                        local_400[6] = (RTCHitN)auVar271[6];
                        local_400[7] = (RTCHitN)auVar271[7];
                        local_400[8] = (RTCHitN)auVar271[8];
                        local_400[9] = (RTCHitN)auVar271[9];
                        local_400[10] = (RTCHitN)auVar271[10];
                        local_400[0xb] = (RTCHitN)auVar271[0xb];
                        local_400[0xc] = (RTCHitN)auVar271[0xc];
                        local_400[0xd] = (RTCHitN)auVar271[0xd];
                        local_400[0xe] = (RTCHitN)auVar271[0xe];
                        local_400[0xf] = (RTCHitN)auVar271[0xf];
                        local_400[0x10] = (RTCHitN)auVar271[0x10];
                        local_400[0x11] = (RTCHitN)auVar271[0x11];
                        local_400[0x12] = (RTCHitN)auVar271[0x12];
                        local_400[0x13] = (RTCHitN)auVar271[0x13];
                        local_400[0x14] = (RTCHitN)auVar271[0x14];
                        local_400[0x15] = (RTCHitN)auVar271[0x15];
                        local_400[0x16] = (RTCHitN)auVar271[0x16];
                        local_400[0x17] = (RTCHitN)auVar271[0x17];
                        local_400[0x18] = (RTCHitN)auVar271[0x18];
                        local_400[0x19] = (RTCHitN)auVar271[0x19];
                        local_400[0x1a] = (RTCHitN)auVar271[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar271[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar271[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar271[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar271[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar271[0x1f];
                        local_400[0x20] = (RTCHitN)auVar271[0x20];
                        local_400[0x21] = (RTCHitN)auVar271[0x21];
                        local_400[0x22] = (RTCHitN)auVar271[0x22];
                        local_400[0x23] = (RTCHitN)auVar271[0x23];
                        local_400[0x24] = (RTCHitN)auVar271[0x24];
                        local_400[0x25] = (RTCHitN)auVar271[0x25];
                        local_400[0x26] = (RTCHitN)auVar271[0x26];
                        local_400[0x27] = (RTCHitN)auVar271[0x27];
                        local_400[0x28] = (RTCHitN)auVar271[0x28];
                        local_400[0x29] = (RTCHitN)auVar271[0x29];
                        local_400[0x2a] = (RTCHitN)auVar271[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar271[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar271[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar271[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar271[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar271[0x2f];
                        local_400[0x30] = (RTCHitN)auVar271[0x30];
                        local_400[0x31] = (RTCHitN)auVar271[0x31];
                        local_400[0x32] = (RTCHitN)auVar271[0x32];
                        local_400[0x33] = (RTCHitN)auVar271[0x33];
                        local_400[0x34] = (RTCHitN)auVar271[0x34];
                        local_400[0x35] = (RTCHitN)auVar271[0x35];
                        local_400[0x36] = (RTCHitN)auVar271[0x36];
                        local_400[0x37] = (RTCHitN)auVar271[0x37];
                        local_400[0x38] = (RTCHitN)auVar271[0x38];
                        local_400[0x39] = (RTCHitN)auVar271[0x39];
                        local_400[0x3a] = (RTCHitN)auVar271[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar271[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar271[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar271[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar271[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar271[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar271 = vmovdqa64_avx512f(local_4c0);
                        local_280 = vmovdqa64_avx512f(auVar271);
                        vpcmpeqd_avx2(auVar271._0_32_,auVar271._0_32_);
                        local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar276;
                        auVar141 = vmovdqa64_avx512f(local_500);
                        local_780 = vmovdqa64_avx512f(auVar141);
                        local_a50.valid = (int *)local_780;
                        local_a50.geometryUserPtr = pGVar3->userPtr;
                        local_a50.context = context->user;
                        local_a50.hit = local_400;
                        local_a50.N = 0x10;
                        local_a50.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar275 = ZEXT1664(auVar274);
                          auVar280 = ZEXT1664(auVar75);
                          auVar281 = ZEXT1664(auVar17);
                          auVar283 = ZEXT1664(local_a00._0_16_);
                          auVar288 = ZEXT1664(auVar18);
                          (*pGVar3->occlusionFilterN)(&local_a50);
                          auVar169 = ZEXT3264(_local_a20);
                          auVar141 = vmovdqa64_avx512f(local_780);
                        }
                        uVar19 = vptestmd_avx512f(auVar141,auVar141);
                        if ((short)uVar19 != 0) {
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar275 = ZEXT1664(auVar275._0_16_);
                            auVar280 = ZEXT1664(auVar280._0_16_);
                            auVar281 = ZEXT1664(auVar281._0_16_);
                            auVar283 = ZEXT1664(auVar283._0_16_);
                            auVar288 = ZEXT1664(auVar288._0_16_);
                            (*p_Var7)(&local_a50);
                            auVar169 = ZEXT3264(_local_a20);
                            auVar141 = vmovdqa64_avx512f(local_780);
                          }
                          auVar271 = ZEXT464((uint)fVar277);
                          uVar66 = vptestmd_avx512f(auVar141,auVar141);
                          auVar141 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar8 = (bool)((byte)uVar66 & 1);
                          auVar142._0_4_ =
                               (uint)bVar8 * auVar141._0_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x200);
                          bVar8 = (bool)((byte)(uVar66 >> 1) & 1);
                          auVar142._4_4_ =
                               (uint)bVar8 * auVar141._4_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x204);
                          bVar8 = (bool)((byte)(uVar66 >> 2) & 1);
                          auVar142._8_4_ =
                               (uint)bVar8 * auVar141._8_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x208);
                          bVar8 = (bool)((byte)(uVar66 >> 3) & 1);
                          auVar142._12_4_ =
                               (uint)bVar8 * auVar141._12_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x20c);
                          bVar8 = (bool)((byte)(uVar66 >> 4) & 1);
                          auVar142._16_4_ =
                               (uint)bVar8 * auVar141._16_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x210);
                          bVar8 = (bool)((byte)(uVar66 >> 5) & 1);
                          auVar142._20_4_ =
                               (uint)bVar8 * auVar141._20_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x214);
                          bVar8 = (bool)((byte)(uVar66 >> 6) & 1);
                          auVar142._24_4_ =
                               (uint)bVar8 * auVar141._24_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x218);
                          bVar8 = (bool)((byte)(uVar66 >> 7) & 1);
                          auVar142._28_4_ =
                               (uint)bVar8 * auVar141._28_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x21c);
                          bVar8 = (bool)((byte)(uVar66 >> 8) & 1);
                          auVar142._32_4_ =
                               (uint)bVar8 * auVar141._32_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x220);
                          bVar8 = (bool)((byte)(uVar66 >> 9) & 1);
                          auVar142._36_4_ =
                               (uint)bVar8 * auVar141._36_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x224);
                          bVar8 = (bool)((byte)(uVar66 >> 10) & 1);
                          auVar142._40_4_ =
                               (uint)bVar8 * auVar141._40_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x228);
                          bVar8 = (bool)((byte)(uVar66 >> 0xb) & 1);
                          auVar142._44_4_ =
                               (uint)bVar8 * auVar141._44_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x22c);
                          bVar8 = (bool)((byte)(uVar66 >> 0xc) & 1);
                          auVar142._48_4_ =
                               (uint)bVar8 * auVar141._48_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x230);
                          bVar8 = (bool)((byte)(uVar66 >> 0xd) & 1);
                          auVar142._52_4_ =
                               (uint)bVar8 * auVar141._52_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x234);
                          bVar8 = (bool)((byte)(uVar66 >> 0xe) & 1);
                          auVar142._56_4_ =
                               (uint)bVar8 * auVar141._56_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x238);
                          bVar8 = SUB81(uVar66 >> 0xf,0);
                          auVar142._60_4_ =
                               (uint)bVar8 * auVar141._60_4_ |
                               (uint)!bVar8 * *(int *)(local_a50.ray + 0x23c);
                          *(undefined1 (*) [64])(local_a50.ray + 0x200) = auVar142;
                          bVar62 = 1;
                          if ((short)uVar66 != 0) goto LAB_01baf48c;
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar277;
                      }
                      auVar271 = ZEXT464((uint)fVar277);
                      bVar62 = 0;
                      goto LAB_01baf48c;
                    }
                  }
                  bVar65 = uVar66 < 4;
                  uVar66 = uVar66 + 1;
                } while (uVar66 != 5);
                bVar65 = false;
                bVar62 = 5;
LAB_01baf483:
                auVar169 = ZEXT3264(_local_a20);
LAB_01baf48c:
                bVar63 = (bool)(bVar63 | bVar65 & bVar62);
                uVar178 = *(undefined4 *)(ray + k * 4 + 0x200);
                auVar166._4_4_ = uVar178;
                auVar166._0_4_ = uVar178;
                auVar166._8_4_ = uVar178;
                auVar166._12_4_ = uVar178;
                auVar166._16_4_ = uVar178;
                auVar166._20_4_ = uVar178;
                auVar166._24_4_ = uVar178;
                auVar166._28_4_ = uVar178;
                auVar51._4_4_ = fStack_6fc;
                auVar51._0_4_ = local_700;
                auVar51._8_4_ = fStack_6f8;
                auVar51._12_4_ = fStack_6f4;
                auVar51._16_4_ = fStack_6f0;
                auVar51._20_4_ = fStack_6ec;
                auVar51._24_4_ = fStack_6e8;
                auVar51._28_4_ = fStack_6e4;
                uVar19 = vcmpps_avx512vl(auVar166,auVar51,0xd);
                bVar57 = ~('\x01' << ((byte)iVar23 & 0x1f)) & bVar57 & (byte)uVar19;
                auVar137 = local_720;
              } while (bVar57 != 0);
            }
            uVar21 = vpcmpgtd_avx512vl(auVar137,local_6c0);
            uVar22 = vpcmpd_avx512vl(local_6c0,local_640,1);
            auVar223._0_4_ = fVar172 + (float)local_440._0_4_;
            auVar223._4_4_ = fVar172 + (float)local_440._4_4_;
            auVar223._8_4_ = fVar172 + fStack_438;
            auVar223._12_4_ = fVar172 + fStack_434;
            auVar223._16_4_ = fVar172 + fStack_430;
            auVar223._20_4_ = fVar172 + fStack_42c;
            auVar223._24_4_ = fVar172 + fStack_428;
            auVar223._28_4_ = fVar172 + fStack_424;
            uVar19 = vcmpps_avx512vl(auVar223,auVar166,2);
            bVar58 = bVar58 & (byte)uVar22 & (byte)uVar19;
            auVar224._0_4_ = fVar172 + local_6a0._0_4_;
            auVar224._4_4_ = fVar172 + local_6a0._4_4_;
            auVar224._8_4_ = fVar172 + local_6a0._8_4_;
            auVar224._12_4_ = fVar172 + local_6a0._12_4_;
            auVar224._16_4_ = fVar172 + local_6a0._16_4_;
            auVar224._20_4_ = fVar172 + local_6a0._20_4_;
            auVar224._24_4_ = fVar172 + local_6a0._24_4_;
            auVar224._28_4_ = fVar172 + local_6a0._28_4_;
            uVar19 = vcmpps_avx512vl(auVar224,auVar166,2);
            bVar53 = bVar53 & (byte)uVar21 & (byte)uVar19 | bVar58;
            if (bVar53 != 0) {
              abStack_1a0[uVar60 * 0x60] = bVar53;
              auVar139._0_4_ =
                   (uint)(bVar58 & 1) * local_440._0_4_ |
                   (uint)!(bool)(bVar58 & 1) * (int)local_6a0._0_4_;
              bVar65 = (bool)(bVar58 >> 1 & 1);
              auVar139._4_4_ = (uint)bVar65 * local_440._4_4_ | (uint)!bVar65 * (int)local_6a0._4_4_
              ;
              bVar65 = (bool)(bVar58 >> 2 & 1);
              auVar139._8_4_ = (uint)bVar65 * (int)fStack_438 | (uint)!bVar65 * (int)local_6a0._8_4_
              ;
              bVar65 = (bool)(bVar58 >> 3 & 1);
              auVar139._12_4_ =
                   (uint)bVar65 * (int)fStack_434 | (uint)!bVar65 * (int)local_6a0._12_4_;
              bVar65 = (bool)(bVar58 >> 4 & 1);
              auVar139._16_4_ =
                   (uint)bVar65 * (int)fStack_430 | (uint)!bVar65 * (int)local_6a0._16_4_;
              bVar65 = (bool)(bVar58 >> 5 & 1);
              auVar139._20_4_ =
                   (uint)bVar65 * (int)fStack_42c | (uint)!bVar65 * (int)local_6a0._20_4_;
              auVar139._24_4_ =
                   (uint)(bVar58 >> 6) * (int)fStack_428 |
                   (uint)!(bool)(bVar58 >> 6) * (int)local_6a0._24_4_;
              auVar139._28_4_ = local_6a0._28_4_;
              *(undefined1 (*) [32])(auStack_180 + uVar60 * 0x60) = auVar139;
              uVar66 = vmovlps_avx(local_6d0);
              (&uStack_160)[uVar60 * 0xc] = uVar66;
              aiStack_158[uVar60 * 0x18] = iVar61 + 1;
              uVar60 = (ulong)((int)uVar60 + 1);
            }
          }
        }
      }
    }
    do {
      uVar68 = (uint)uVar60;
      uVar60 = (ulong)(uVar68 - 1);
      if (uVar68 == 0) {
        if (bVar63 != false) {
          return bVar63;
        }
        uVar178 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar31._4_4_ = uVar178;
        auVar31._0_4_ = uVar178;
        auVar31._8_4_ = uVar178;
        auVar31._12_4_ = uVar178;
        uVar19 = vcmpps_avx512vl(local_6e0,auVar31,2);
        uVar59 = (uint)uVar19 & (uint)local_8c8 - 1 & (uint)local_8c8;
        local_8c8 = (ulong)uVar59;
        if (uVar59 == 0) {
          return false;
        }
        goto LAB_01bad06a;
      }
      lVar56 = uVar60 * 0x60;
      auVar99 = *(undefined1 (*) [32])(auStack_180 + lVar56);
      auVar195._0_4_ = fVar172 + auVar99._0_4_;
      auVar195._4_4_ = fVar172 + auVar99._4_4_;
      auVar195._8_4_ = fVar172 + auVar99._8_4_;
      auVar195._12_4_ = fVar172 + auVar99._12_4_;
      auVar195._16_4_ = fVar172 + auVar99._16_4_;
      auVar195._20_4_ = fVar172 + auVar99._20_4_;
      auVar195._24_4_ = fVar172 + auVar99._24_4_;
      auVar195._28_4_ = fVar172 + auVar99._28_4_;
      uVar178 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar35._4_4_ = uVar178;
      auVar35._0_4_ = uVar178;
      auVar35._8_4_ = uVar178;
      auVar35._12_4_ = uVar178;
      auVar35._16_4_ = uVar178;
      auVar35._20_4_ = uVar178;
      auVar35._24_4_ = uVar178;
      auVar35._28_4_ = uVar178;
      uVar19 = vcmpps_avx512vl(auVar195,auVar35,2);
      uVar67 = (uint)uVar19 & (uint)abStack_1a0[lVar56];
    } while (uVar67 == 0);
    uVar66 = (&uStack_160)[uVar60 * 0xc];
    auVar192._8_8_ = 0;
    auVar192._0_8_ = uVar66;
    auVar225._8_4_ = 0x7f800000;
    auVar225._0_8_ = 0x7f8000007f800000;
    auVar225._12_4_ = 0x7f800000;
    auVar225._16_4_ = 0x7f800000;
    auVar225._20_4_ = 0x7f800000;
    auVar225._24_4_ = 0x7f800000;
    auVar225._28_4_ = 0x7f800000;
    auVar96 = vblendmps_avx512vl(auVar225,auVar99);
    bVar53 = (byte)uVar67;
    auVar140._0_4_ =
         (uint)(bVar53 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar53 & 1) * (int)auVar99._0_4_;
    bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
    auVar140._4_4_ = (uint)bVar65 * auVar96._4_4_ | (uint)!bVar65 * (int)auVar99._4_4_;
    bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
    auVar140._8_4_ = (uint)bVar65 * auVar96._8_4_ | (uint)!bVar65 * (int)auVar99._8_4_;
    bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
    auVar140._12_4_ = (uint)bVar65 * auVar96._12_4_ | (uint)!bVar65 * (int)auVar99._12_4_;
    bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
    auVar140._16_4_ = (uint)bVar65 * auVar96._16_4_ | (uint)!bVar65 * (int)auVar99._16_4_;
    bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
    auVar140._20_4_ = (uint)bVar65 * auVar96._20_4_ | (uint)!bVar65 * (int)auVar99._20_4_;
    bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
    auVar140._24_4_ = (uint)bVar65 * auVar96._24_4_ | (uint)!bVar65 * (int)auVar99._24_4_;
    auVar140._28_4_ =
         (uVar67 >> 7) * auVar96._28_4_ | (uint)!SUB41(uVar67 >> 7,0) * (int)auVar99._28_4_;
    auVar99 = vshufps_avx(auVar140,auVar140,0xb1);
    auVar99 = vminps_avx(auVar140,auVar99);
    auVar96 = vshufpd_avx(auVar99,auVar99,5);
    auVar99 = vminps_avx(auVar99,auVar96);
    auVar96 = vpermpd_avx2(auVar99,0x4e);
    auVar99 = vminps_avx(auVar99,auVar96);
    uVar19 = vcmpps_avx512vl(auVar140,auVar99,0);
    bVar57 = (byte)uVar19 & bVar53;
    if (bVar57 != 0) {
      uVar67 = (uint)bVar57;
    }
    uVar143 = 0;
    for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
      uVar143 = uVar143 + 1;
    }
    iVar61 = aiStack_158[uVar60 * 0x18];
    bVar53 = ~('\x01' << ((byte)uVar143 & 0x1f)) & bVar53;
    abStack_1a0[lVar56] = bVar53;
    if (bVar53 == 0) {
      uVar68 = uVar68 - 1;
    }
    uVar178 = (undefined4)uVar66;
    auVar168._4_4_ = uVar178;
    auVar168._0_4_ = uVar178;
    auVar168._8_4_ = uVar178;
    auVar168._12_4_ = uVar178;
    auVar168._16_4_ = uVar178;
    auVar168._20_4_ = uVar178;
    auVar168._24_4_ = uVar178;
    auVar168._28_4_ = uVar178;
    auVar75 = vmovshdup_avx(auVar192);
    auVar75 = vsubps_avx(auVar75,auVar192);
    auVar196._0_4_ = auVar75._0_4_;
    auVar196._4_4_ = auVar196._0_4_;
    auVar196._8_4_ = auVar196._0_4_;
    auVar196._12_4_ = auVar196._0_4_;
    auVar196._16_4_ = auVar196._0_4_;
    auVar196._20_4_ = auVar196._0_4_;
    auVar196._24_4_ = auVar196._0_4_;
    auVar196._28_4_ = auVar196._0_4_;
    auVar75 = vfmadd132ps_fma(auVar196,auVar168,_DAT_01faff20);
    auVar99 = ZEXT1632(auVar75);
    local_400[0] = (RTCHitN)auVar99[0];
    local_400[1] = (RTCHitN)auVar99[1];
    local_400[2] = (RTCHitN)auVar99[2];
    local_400[3] = (RTCHitN)auVar99[3];
    local_400[4] = (RTCHitN)auVar99[4];
    local_400[5] = (RTCHitN)auVar99[5];
    local_400[6] = (RTCHitN)auVar99[6];
    local_400[7] = (RTCHitN)auVar99[7];
    local_400[8] = (RTCHitN)auVar99[8];
    local_400[9] = (RTCHitN)auVar99[9];
    local_400[10] = (RTCHitN)auVar99[10];
    local_400[0xb] = (RTCHitN)auVar99[0xb];
    local_400[0xc] = (RTCHitN)auVar99[0xc];
    local_400[0xd] = (RTCHitN)auVar99[0xd];
    local_400[0xe] = (RTCHitN)auVar99[0xe];
    local_400[0xf] = (RTCHitN)auVar99[0xf];
    local_400[0x10] = (RTCHitN)auVar99[0x10];
    local_400[0x11] = (RTCHitN)auVar99[0x11];
    local_400[0x12] = (RTCHitN)auVar99[0x12];
    local_400[0x13] = (RTCHitN)auVar99[0x13];
    local_400[0x14] = (RTCHitN)auVar99[0x14];
    local_400[0x15] = (RTCHitN)auVar99[0x15];
    local_400[0x16] = (RTCHitN)auVar99[0x16];
    local_400[0x17] = (RTCHitN)auVar99[0x17];
    local_400[0x18] = (RTCHitN)auVar99[0x18];
    local_400[0x19] = (RTCHitN)auVar99[0x19];
    local_400[0x1a] = (RTCHitN)auVar99[0x1a];
    local_400[0x1b] = (RTCHitN)auVar99[0x1b];
    local_400[0x1c] = (RTCHitN)auVar99[0x1c];
    local_400[0x1d] = (RTCHitN)auVar99[0x1d];
    local_400[0x1e] = (RTCHitN)auVar99[0x1e];
    local_400[0x1f] = (RTCHitN)auVar99[0x1f];
    auVar169 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar143 * 4));
    uVar60 = (ulong)uVar68;
    fVar260 = fVar172;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }